

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  long lVar95;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar96;
  byte bVar97;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  ulong uVar98;
  undefined4 uVar99;
  undefined8 in_R11;
  ulong uVar100;
  bool bVar101;
  byte bVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar105 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar143 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar146 [16];
  undefined1 auVar157 [32];
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar185;
  float fVar186;
  undefined1 auVar174 [32];
  float fVar187;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar188;
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar199 [16];
  undefined1 auVar203 [32];
  float fVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined8 uVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar238;
  undefined1 auVar231 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar232 [32];
  float fVar239;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar250;
  undefined1 auVar246 [32];
  float fVar248;
  float fVar249;
  float fVar251;
  undefined1 auVar247 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar256;
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  float fVar267;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar265;
  float fVar266;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 in_ZMM9 [64];
  undefined1 auVar264 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar276;
  float fVar277;
  undefined1 auVar274 [32];
  undefined1 auVar273 [28];
  undefined1 in_ZMM10 [64];
  undefined1 auVar275 [64];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [64];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c24;
  uint uStack_b24;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 auStack_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  Primitive *local_918;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  uint local_800;
  uint uStack_7fc;
  uint uStack_7f8;
  uint uStack_7f4;
  uint local_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  RTCHitN local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined8 local_790;
  undefined8 uStack_788;
  undefined1 local_780 [16];
  uint local_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  uint uStack_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar278 [16];
  undefined1 auVar288 [64];
  
  PVar6 = prim[1];
  uVar94 = (ulong)(byte)PVar6;
  fVar103 = *(float *)(prim + uVar94 * 0x19 + 0x12);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + uVar94 * 0x19 + 6));
  auVar107._0_4_ = fVar103 * auVar10._0_4_;
  auVar107._4_4_ = fVar103 * auVar10._4_4_;
  auVar107._8_4_ = fVar103 * auVar10._8_4_;
  auVar107._12_4_ = fVar103 * auVar10._12_4_;
  auVar221._0_4_ = fVar103 * auVar11._0_4_;
  auVar221._4_4_ = fVar103 * auVar11._4_4_;
  auVar221._8_4_ = fVar103 * auVar11._8_4_;
  auVar221._12_4_ = fVar103 * auVar11._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar94 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar10);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar94 * 5 + 6);
  auVar12 = vpmovsxbd_avx2(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar94 * 6 + 6);
  auVar13 = vpmovsxbd_avx2(auVar1);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar94 * 0xb + 6);
  auVar118 = vpmovsxbd_avx2(auVar2);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar94 * 0xc + 6);
  auVar14 = vpmovsxbd_avx2(auVar111);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar94 * 0xd + 6);
  auVar233 = vpmovsxbd_avx2(auVar3);
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar94 * 0x12 + 6);
  auVar15 = vpmovsxbd_avx2(auVar4);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar94 * 0x13 + 6);
  auVar123 = vpmovsxbd_avx2(auVar5);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar291._8_8_ = 0;
  auVar291._0_8_ = *(ulong *)(prim + uVar94 * 0x14 + 6);
  auVar180 = vpmovsxbd_avx2(auVar291);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar245._4_4_ = auVar221._0_4_;
  auVar245._0_4_ = auVar221._0_4_;
  auVar245._8_4_ = auVar221._0_4_;
  auVar245._12_4_ = auVar221._0_4_;
  auVar245._16_4_ = auVar221._0_4_;
  auVar245._20_4_ = auVar221._0_4_;
  auVar245._24_4_ = auVar221._0_4_;
  auVar245._28_4_ = auVar221._0_4_;
  auVar10 = vmovshdup_avx(auVar221);
  uVar220 = auVar10._0_8_;
  auVar294._8_8_ = uVar220;
  auVar294._0_8_ = uVar220;
  auVar294._16_8_ = uVar220;
  auVar294._24_8_ = uVar220;
  auVar10 = vshufps_avx(auVar221,auVar221,0xaa);
  fVar103 = auVar10._0_4_;
  auVar247._0_4_ = fVar103 * auVar13._0_4_;
  fVar133 = auVar10._4_4_;
  auVar247._4_4_ = fVar133 * auVar13._4_4_;
  auVar247._8_4_ = fVar103 * auVar13._8_4_;
  auVar247._12_4_ = fVar133 * auVar13._12_4_;
  auVar247._16_4_ = fVar103 * auVar13._16_4_;
  auVar247._20_4_ = fVar133 * auVar13._20_4_;
  auVar247._28_36_ = in_ZMM10._28_36_;
  auVar247._24_4_ = fVar103 * auVar13._24_4_;
  auVar275._0_4_ = auVar233._0_4_ * fVar103;
  auVar275._4_4_ = auVar233._4_4_ * fVar133;
  auVar275._8_4_ = auVar233._8_4_ * fVar103;
  auVar275._12_4_ = auVar233._12_4_ * fVar133;
  auVar275._16_4_ = auVar233._16_4_ * fVar103;
  auVar275._20_4_ = auVar233._20_4_ * fVar133;
  auVar275._28_36_ = in_ZMM9._28_36_;
  auVar275._24_4_ = auVar233._24_4_ * fVar103;
  auVar119._0_4_ = auVar180._0_4_ * fVar103;
  auVar119._4_4_ = auVar180._4_4_ * fVar133;
  auVar119._8_4_ = auVar180._8_4_ * fVar103;
  auVar119._12_4_ = auVar180._12_4_ * fVar133;
  auVar119._16_4_ = auVar180._16_4_ * fVar103;
  auVar119._20_4_ = auVar180._20_4_ * fVar133;
  auVar119._24_4_ = auVar180._24_4_ * fVar103;
  auVar119._28_4_ = 0;
  auVar10 = vfmadd231ps_fma(auVar247._0_32_,auVar294,auVar12);
  auVar11 = vfmadd231ps_fma(auVar275._0_32_,auVar294,auVar14);
  auVar1 = vfmadd231ps_fma(auVar119,auVar123,auVar294);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar245,auVar126);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar245,auVar118);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar15,auVar245);
  auVar292._4_4_ = auVar107._0_4_;
  auVar292._0_4_ = auVar107._0_4_;
  auVar292._8_4_ = auVar107._0_4_;
  auVar292._12_4_ = auVar107._0_4_;
  auVar292._16_4_ = auVar107._0_4_;
  auVar292._20_4_ = auVar107._0_4_;
  auVar292._24_4_ = auVar107._0_4_;
  auVar292._28_4_ = auVar107._0_4_;
  auVar10 = vmovshdup_avx(auVar107);
  uVar220 = auVar10._0_8_;
  auVar295._8_8_ = uVar220;
  auVar295._0_8_ = uVar220;
  auVar295._16_8_ = uVar220;
  auVar295._24_8_ = uVar220;
  auVar10 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar103 = auVar10._0_4_;
  auVar116._0_4_ = fVar103 * auVar13._0_4_;
  fVar133 = auVar10._4_4_;
  auVar116._4_4_ = fVar133 * auVar13._4_4_;
  auVar116._8_4_ = fVar103 * auVar13._8_4_;
  auVar116._12_4_ = fVar133 * auVar13._12_4_;
  auVar116._16_4_ = fVar103 * auVar13._16_4_;
  auVar116._20_4_ = fVar133 * auVar13._20_4_;
  auVar116._24_4_ = fVar103 * auVar13._24_4_;
  auVar116._28_4_ = 0;
  auVar246._4_4_ = auVar233._4_4_ * fVar133;
  auVar246._0_4_ = auVar233._0_4_ * fVar103;
  auVar246._8_4_ = auVar233._8_4_ * fVar103;
  auVar246._12_4_ = auVar233._12_4_ * fVar133;
  auVar246._16_4_ = auVar233._16_4_ * fVar103;
  auVar246._20_4_ = auVar233._20_4_ * fVar133;
  auVar246._24_4_ = auVar233._24_4_ * fVar103;
  auVar246._28_4_ = auVar13._28_4_;
  auVar13._4_4_ = auVar180._4_4_ * fVar133;
  auVar13._0_4_ = auVar180._0_4_ * fVar103;
  auVar13._8_4_ = auVar180._8_4_ * fVar103;
  auVar13._12_4_ = auVar180._12_4_ * fVar133;
  auVar13._16_4_ = auVar180._16_4_ * fVar103;
  auVar13._20_4_ = auVar180._20_4_ * fVar133;
  auVar13._24_4_ = auVar180._24_4_ * fVar103;
  auVar13._28_4_ = fVar133;
  auVar10 = vfmadd231ps_fma(auVar116,auVar295,auVar12);
  auVar111 = vfmadd231ps_fma(auVar246,auVar295,auVar14);
  auVar3 = vfmadd231ps_fma(auVar13,auVar295,auVar123);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar292,auVar126);
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar292,auVar118);
  local_9e0._8_4_ = 0x7fffffff;
  local_9e0._0_8_ = 0x7fffffff7fffffff;
  local_9e0._12_4_ = 0x7fffffff;
  local_9e0._16_4_ = 0x7fffffff;
  local_9e0._20_4_ = 0x7fffffff;
  local_9e0._24_4_ = 0x7fffffff;
  local_9e0._28_4_ = 0x7fffffff;
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar292,auVar15);
  auVar126 = vandps_avx(ZEXT1632(auVar2),local_9e0);
  auVar149._8_4_ = 0x219392ef;
  auVar149._0_8_ = 0x219392ef219392ef;
  auVar149._12_4_ = 0x219392ef;
  auVar149._16_4_ = 0x219392ef;
  auVar149._20_4_ = 0x219392ef;
  auVar149._24_4_ = 0x219392ef;
  auVar149._28_4_ = 0x219392ef;
  auVar126 = vcmpps_avx(auVar126,auVar149,1);
  auVar12 = vblendvps_avx(ZEXT1632(auVar2),auVar149,auVar126);
  auVar275 = ZEXT3264(local_9e0);
  auVar126 = vandps_avx(ZEXT1632(auVar11),local_9e0);
  auVar126 = vcmpps_avx(auVar126,auVar149,1);
  auVar13 = vblendvps_avx(ZEXT1632(auVar11),auVar149,auVar126);
  auVar126 = vandps_avx(local_9e0,ZEXT1632(auVar1));
  auVar126 = vcmpps_avx(auVar126,auVar149,1);
  auVar118 = vrcpps_avx(auVar12);
  auVar126 = vblendvps_avx(ZEXT1632(auVar1),auVar149,auVar126);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar226._16_4_ = 0x3f800000;
  auVar226._20_4_ = 0x3f800000;
  auVar226._24_4_ = 0x3f800000;
  auVar226._28_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar12,auVar118,auVar226);
  auVar12 = vrcpps_avx(auVar13);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar118,auVar118);
  auVar118 = vrcpps_avx(auVar126);
  auVar11 = vfnmadd213ps_fma(auVar13,auVar12,auVar226);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar12,auVar12);
  auVar1 = vfnmadd213ps_fma(auVar126,auVar118,auVar226);
  auVar1 = vfmadd132ps_fma(ZEXT1632(auVar1),auVar118,auVar118);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 7 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar4));
  auVar12 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 9 + 6));
  auVar118._4_4_ = auVar10._4_4_ * auVar126._4_4_;
  auVar118._0_4_ = auVar10._0_4_ * auVar126._0_4_;
  auVar118._8_4_ = auVar10._8_4_ * auVar126._8_4_;
  auVar118._12_4_ = auVar10._12_4_ * auVar126._12_4_;
  auVar118._16_4_ = auVar126._16_4_ * 0.0;
  auVar118._20_4_ = auVar126._20_4_ * 0.0;
  auVar118._24_4_ = auVar126._24_4_ * 0.0;
  auVar118._28_4_ = auVar126._28_4_;
  auVar126 = vcvtdq2ps_avx(auVar12);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar4));
  auVar14._4_4_ = auVar10._4_4_ * auVar126._4_4_;
  auVar14._0_4_ = auVar10._0_4_ * auVar126._0_4_;
  auVar14._8_4_ = auVar10._8_4_ * auVar126._8_4_;
  auVar14._12_4_ = auVar10._12_4_ * auVar126._12_4_;
  auVar14._16_4_ = auVar126._16_4_ * 0.0;
  auVar14._20_4_ = auVar126._20_4_ * 0.0;
  auVar14._24_4_ = auVar126._24_4_ * 0.0;
  auVar14._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 0xe + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar111));
  auVar147._1_3_ = 0;
  auVar147[0] = PVar6;
  auVar12 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar233._4_4_ = auVar11._4_4_ * auVar126._4_4_;
  auVar233._0_4_ = auVar11._0_4_ * auVar126._0_4_;
  auVar233._8_4_ = auVar11._8_4_ * auVar126._8_4_;
  auVar233._12_4_ = auVar11._12_4_ * auVar126._12_4_;
  auVar233._16_4_ = auVar126._16_4_ * 0.0;
  auVar233._20_4_ = auVar126._20_4_ * 0.0;
  auVar233._24_4_ = auVar126._24_4_ * 0.0;
  auVar233._28_4_ = auVar126._28_4_;
  auVar126 = vcvtdq2ps_avx(auVar12);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar111));
  auVar15._4_4_ = auVar11._4_4_ * auVar126._4_4_;
  auVar15._0_4_ = auVar11._0_4_ * auVar126._0_4_;
  auVar15._8_4_ = auVar11._8_4_ * auVar126._8_4_;
  auVar15._12_4_ = auVar11._12_4_ * auVar126._12_4_;
  auVar15._16_4_ = auVar126._16_4_ * 0.0;
  auVar15._20_4_ = auVar126._20_4_ * 0.0;
  auVar15._24_4_ = auVar126._24_4_ * 0.0;
  auVar15._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 0x15 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar3));
  auVar123._4_4_ = auVar126._4_4_ * auVar1._4_4_;
  auVar123._0_4_ = auVar126._0_4_ * auVar1._0_4_;
  auVar123._8_4_ = auVar126._8_4_ * auVar1._8_4_;
  auVar123._12_4_ = auVar126._12_4_ * auVar1._12_4_;
  auVar123._16_4_ = auVar126._16_4_ * 0.0;
  auVar123._20_4_ = auVar126._20_4_ * 0.0;
  auVar123._24_4_ = auVar126._24_4_ * 0.0;
  auVar123._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 0x17 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar3));
  auVar180._4_4_ = auVar1._4_4_ * auVar126._4_4_;
  auVar180._0_4_ = auVar1._0_4_ * auVar126._0_4_;
  auVar180._8_4_ = auVar1._8_4_ * auVar126._8_4_;
  auVar180._12_4_ = auVar1._12_4_ * auVar126._12_4_;
  auVar180._16_4_ = auVar126._16_4_ * 0.0;
  auVar180._20_4_ = auVar126._20_4_ * 0.0;
  auVar180._24_4_ = auVar126._24_4_ * 0.0;
  auVar180._28_4_ = auVar126._28_4_;
  auVar126 = vpminsd_avx2(auVar118,auVar14);
  auVar12 = vpminsd_avx2(auVar233,auVar15);
  auVar126 = vmaxps_avx(auVar126,auVar12);
  auVar12 = vpminsd_avx2(auVar123,auVar180);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar258._4_4_ = uVar99;
  auVar258._0_4_ = uVar99;
  auVar258._8_4_ = uVar99;
  auVar258._12_4_ = uVar99;
  auVar258._16_4_ = uVar99;
  auVar258._20_4_ = uVar99;
  auVar258._24_4_ = uVar99;
  auVar258._28_4_ = uVar99;
  auVar12 = vmaxps_avx(auVar12,auVar258);
  auVar126 = vmaxps_avx(auVar126,auVar12);
  local_380._4_4_ = auVar126._4_4_ * 0.99999964;
  local_380._0_4_ = auVar126._0_4_ * 0.99999964;
  local_380._8_4_ = auVar126._8_4_ * 0.99999964;
  local_380._12_4_ = auVar126._12_4_ * 0.99999964;
  local_380._16_4_ = auVar126._16_4_ * 0.99999964;
  local_380._20_4_ = auVar126._20_4_ * 0.99999964;
  local_380._24_4_ = auVar126._24_4_ * 0.99999964;
  local_380._28_4_ = 0x3f7ffffa;
  auVar126 = vpmaxsd_avx2(auVar118,auVar14);
  auVar12 = vpmaxsd_avx2(auVar233,auVar15);
  auVar126 = vminps_avx(auVar126,auVar12);
  auVar12 = vpmaxsd_avx2(auVar123,auVar180);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar174._4_4_ = uVar99;
  auVar174._0_4_ = uVar99;
  auVar174._8_4_ = uVar99;
  auVar174._12_4_ = uVar99;
  auVar174._16_4_ = uVar99;
  auVar174._20_4_ = uVar99;
  auVar174._24_4_ = uVar99;
  auVar174._28_4_ = uVar99;
  auVar12 = vminps_avx(auVar12,auVar174);
  auVar126 = vminps_avx(auVar126,auVar12);
  auVar12._4_4_ = auVar126._4_4_ * 1.0000004;
  auVar12._0_4_ = auVar126._0_4_ * 1.0000004;
  auVar12._8_4_ = auVar126._8_4_ * 1.0000004;
  auVar12._12_4_ = auVar126._12_4_ * 1.0000004;
  auVar12._16_4_ = auVar126._16_4_ * 1.0000004;
  auVar12._20_4_ = auVar126._20_4_ * 1.0000004;
  auVar12._24_4_ = auVar126._24_4_ * 1.0000004;
  auVar12._28_4_ = auVar126._28_4_;
  auVar147[4] = PVar6;
  auVar147._5_3_ = 0;
  auVar147[8] = PVar6;
  auVar147._9_3_ = 0;
  auVar147[0xc] = PVar6;
  auVar147._13_3_ = 0;
  auVar147[0x10] = PVar6;
  auVar147._17_3_ = 0;
  auVar147[0x14] = PVar6;
  auVar147._21_3_ = 0;
  auVar147[0x18] = PVar6;
  auVar147._25_3_ = 0;
  auVar147[0x1c] = PVar6;
  auVar147._29_3_ = 0;
  auVar126 = vcmpps_avx(local_380,auVar12,2);
  auVar12 = vpcmpgtd_avx2(auVar147,_DAT_01fb4ba0);
  auVar126 = vandps_avx(auVar126,auVar12);
  auVar148._16_16_ = mm_lookupmask_ps._240_16_;
  auVar148._0_16_ = mm_lookupmask_ps._240_16_;
  uVar99 = vmovmskps_avx(auVar126);
  local_908 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar99);
  local_340 = vblendps_avx(auVar148,ZEXT832(0) << 0x20,0x80);
  local_918 = prim;
LAB_013884b6:
  if (local_908 == 0) {
LAB_0138ac85:
    return local_908 != 0;
  }
  lVar95 = 0;
  for (uVar94 = local_908; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    lVar95 = lVar95 + 1;
  }
  uVar93 = *(uint *)(local_918 + 2);
  local_800 = *(uint *)(local_918 + lVar95 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar93].ptr;
  uVar94 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_800);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar95 = *(long *)&pGVar7[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar95 + (long)p_Var8 * uVar94);
  auVar11 = *(undefined1 (*) [16])(lVar95 + (uVar94 + 1) * (long)p_Var8);
  auVar1 = *(undefined1 (*) [16])(lVar95 + (uVar94 + 2) * (long)p_Var8);
  local_910 = local_908 - 1 & local_908;
  auVar2 = *(undefined1 (*) [16])(lVar95 + (uVar94 + 3) * (long)p_Var8);
  if (local_910 != 0) {
    uVar98 = local_910 - 1 & local_910;
    for (uVar94 = local_910; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    }
    if (uVar98 != 0) {
      for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar3 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar278._4_4_ = uVar99;
  auVar278._0_4_ = uVar99;
  auVar278._8_4_ = uVar99;
  auVar278._12_4_ = uVar99;
  fStack_6f0 = (float)uVar99;
  _local_700 = auVar278;
  fStack_6ec = (float)uVar99;
  fStack_6e8 = (float)uVar99;
  uStack_6e4 = uVar99;
  auVar282 = ZEXT3264(_local_700);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar283._4_4_ = uVar99;
  auVar283._0_4_ = uVar99;
  auVar283._8_4_ = uVar99;
  auVar283._12_4_ = uVar99;
  fStack_710 = (float)uVar99;
  _local_720 = auVar283;
  fStack_70c = (float)uVar99;
  fStack_708 = (float)uVar99;
  register0x0000151c = uVar99;
  auVar288 = ZEXT3264(_local_720);
  auVar111 = vunpcklps_avx(auVar278,auVar283);
  fVar103 = *(float *)(ray + k * 4 + 0x60);
  auVar285._4_4_ = fVar103;
  auVar285._0_4_ = fVar103;
  auVar285._8_4_ = fVar103;
  auVar285._12_4_ = fVar103;
  fStack_730 = fVar103;
  _local_740 = auVar285;
  fStack_72c = fVar103;
  fStack_728 = fVar103;
  register0x0000155c = fVar103;
  local_970 = vinsertps_avx(auVar111,auVar285,0x28);
  auVar169._0_4_ = (auVar10._0_4_ + auVar11._0_4_ + auVar1._0_4_ + auVar2._0_4_) * 0.25;
  auVar169._4_4_ = (auVar10._4_4_ + auVar11._4_4_ + auVar1._4_4_ + auVar2._4_4_) * 0.25;
  auVar169._8_4_ = (auVar10._8_4_ + auVar11._8_4_ + auVar1._8_4_ + auVar2._8_4_) * 0.25;
  auVar169._12_4_ = (auVar10._12_4_ + auVar11._12_4_ + auVar1._12_4_ + auVar2._12_4_) * 0.25;
  auVar111 = vsubps_avx(auVar169,auVar3);
  auVar111 = vdpps_avx(auVar111,local_970,0x7f);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  auVar264 = ZEXT1664(local_980);
  auVar4 = vrcpss_avx(local_980,local_980);
  auVar5 = vfnmadd213ss_fma(auVar4,local_980,ZEXT416(0x40000000));
  fVar133 = auVar111._0_4_ * auVar4._0_4_ * auVar5._0_4_;
  auVar231._4_4_ = fVar133;
  auVar231._0_4_ = fVar133;
  auVar231._8_4_ = fVar133;
  auVar231._12_4_ = fVar133;
  auVar111 = vfmadd231ps_fma(auVar3,local_970,auVar231);
  auVar111 = vblendps_avx(auVar111,_DAT_01f45a50,8);
  auVar3 = vsubps_avx(auVar10,auVar111);
  auVar1 = vsubps_avx(auVar1,auVar111);
  auVar4 = vsubps_avx(auVar11,auVar111);
  auVar2 = vsubps_avx(auVar2,auVar111);
  auVar10 = vmovshdup_avx(auVar3);
  local_1e0 = auVar10._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar10 = vshufps_avx(auVar3,auVar3,0xaa);
  local_4e0 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar3,auVar3,0xff);
  local_500 = auVar10._0_8_;
  auVar10 = vmovshdup_avx(auVar4);
  local_200 = auVar10._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar10 = vshufps_avx(auVar4,auVar4,0xaa);
  local_520 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar4,auVar4,0xff);
  local_540 = auVar10._0_8_;
  auVar10 = vmovshdup_avx(auVar1);
  local_220 = auVar10._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar10 = vshufps_avx(auVar1,auVar1,0xaa);
  local_560 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar1,auVar1,0xff);
  local_580 = auVar10._0_8_;
  auVar10 = vmovshdup_avx(auVar2);
  local_240 = auVar10._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar10 = vshufps_avx(auVar2,auVar2,0xaa);
  local_5a0 = auVar10._0_8_;
  auVar10 = vshufps_avx(auVar2,auVar2,0xff);
  local_5c0 = auVar10._0_8_;
  auVar10 = vfmadd231ps_fma(ZEXT432((uint)(fVar103 * fVar103)),_local_720,_local_720);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_700,_local_700);
  uVar99 = auVar10._0_4_;
  local_260._4_4_ = uVar99;
  local_260._0_4_ = uVar99;
  local_260._8_4_ = uVar99;
  local_260._12_4_ = uVar99;
  local_260._16_4_ = uVar99;
  local_260._20_4_ = uVar99;
  local_260._24_4_ = uVar99;
  local_260._28_4_ = uVar99;
  auVar247 = ZEXT3264(local_260);
  fVar103 = *(float *)(ray + k * 4 + 0x30);
  local_940 = ZEXT416((uint)fVar133);
  local_360 = fVar103 - fVar133;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  uVar94 = 0;
  bVar97 = 0;
  local_c24 = 1;
  local_5e0 = auVar3._0_4_;
  local_600 = auVar4._0_4_;
  local_280 = auVar1._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  fVar188 = auVar2._0_4_;
  local_640 = vandps_avx(auVar275._0_32_,local_260);
  auVar10 = vsqrtss_avx(local_980,local_980);
  auVar11 = vsqrtss_avx(local_980,local_980);
  local_650 = ZEXT816(0x3f80000000000000);
  fVar189 = 0.0;
  uStack_7fc = local_800;
  uStack_7f8 = local_800;
  uStack_7f4 = local_800;
  local_7f0 = uVar93;
  uStack_7ec = uVar93;
  uStack_7e8 = uVar93;
  uStack_7e4 = uVar93;
  local_620 = fVar188;
  fStack_61c = fVar188;
  fStack_618 = fVar188;
  fStack_614 = fVar188;
  fStack_610 = fVar188;
  fStack_60c = fVar188;
  fStack_608 = fVar188;
  fStack_604 = fVar188;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uStack_5dc = local_5e0;
  uStack_5d8 = local_5e0;
  uStack_5d4 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5cc = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5c4 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  do {
    auVar200._8_4_ = 0x3f800000;
    auVar200._0_8_ = 0x3f8000003f800000;
    auVar200._12_4_ = 0x3f800000;
    auVar200._16_4_ = 0x3f800000;
    auVar200._20_4_ = 0x3f800000;
    auVar200._24_4_ = 0x3f800000;
    auVar200._28_4_ = 0x3f800000;
    auVar111 = vmovshdup_avx(local_650);
    auVar111 = vsubps_avx(auVar111,local_650);
    local_8a0._0_4_ = auVar111._0_4_;
    fVar249 = local_8a0._0_4_ * 0.04761905;
    uVar140 = local_650._0_4_;
    local_880._4_4_ = uVar140;
    local_880._0_4_ = uVar140;
    local_880._8_4_ = uVar140;
    local_880._12_4_ = uVar140;
    local_880._16_4_ = uVar140;
    local_880._20_4_ = uVar140;
    local_880._24_4_ = uVar140;
    local_880._28_4_ = uVar140;
    local_8a0._4_4_ = local_8a0._0_4_;
    local_8a0._8_4_ = local_8a0._0_4_;
    local_8a0._12_4_ = local_8a0._0_4_;
    local_8a0._16_4_ = local_8a0._0_4_;
    local_8a0._20_4_ = local_8a0._0_4_;
    local_8a0._24_4_ = local_8a0._0_4_;
    local_8a0._28_4_ = local_8a0._0_4_;
    auVar111 = vfmadd231ps_fma(local_880,local_8a0,_DAT_01f7b040);
    auVar126 = vsubps_avx(auVar200,ZEXT1632(auVar111));
    fVar204 = auVar126._0_4_;
    fVar218 = auVar126._4_4_;
    fVar238 = auVar126._8_4_;
    fVar239 = auVar126._12_4_;
    fVar241 = auVar126._16_4_;
    fVar242 = auVar126._20_4_;
    fVar248 = auVar126._24_4_;
    fVar104 = fVar204 * fVar204 * fVar204;
    fVar134 = fVar218 * fVar218 * fVar218;
    fVar135 = fVar238 * fVar238 * fVar238;
    fVar136 = fVar239 * fVar239 * fVar239;
    fVar137 = fVar241 * fVar241 * fVar241;
    fVar138 = fVar242 * fVar242 * fVar242;
    fVar139 = fVar248 * fVar248 * fVar248;
    fVar217 = auVar111._0_4_;
    fVar219 = auVar111._4_4_;
    fVar251 = auVar111._8_4_;
    fVar240 = auVar111._12_4_;
    fVar158 = fVar217 * fVar217 * fVar217;
    fVar185 = fVar219 * fVar219 * fVar219;
    fVar186 = fVar251 * fVar251 * fVar251;
    fVar187 = fVar240 * fVar240 * fVar240;
    fVar256 = fVar204 * fVar217;
    fVar265 = fVar218 * fVar219;
    fVar266 = fVar238 * fVar251;
    fVar267 = fVar239 * fVar240;
    fVar268 = fVar241 * 0.0;
    fVar269 = fVar242 * 0.0;
    fVar270 = fVar248 * 0.0;
    fVar276 = auVar275._28_4_ + auVar288._28_4_;
    fVar277 = fVar276 + local_8a0._0_4_;
    fVar250 = auVar282._28_4_;
    auVar17._4_4_ = fVar134 * 0.16666667;
    auVar17._0_4_ = fVar104 * 0.16666667;
    auVar17._8_4_ = fVar135 * 0.16666667;
    auVar17._12_4_ = fVar136 * 0.16666667;
    auVar17._16_4_ = fVar137 * 0.16666667;
    auVar17._20_4_ = fVar138 * 0.16666667;
    auVar17._24_4_ = fVar139 * 0.16666667;
    auVar17._28_4_ = fVar277;
    auVar18._4_4_ =
         (fVar218 * fVar265 * 12.0 + fVar265 * fVar219 * 6.0 + fVar185 + fVar134 * 4.0) * 0.16666667
    ;
    auVar18._0_4_ =
         (fVar204 * fVar256 * 12.0 + fVar256 * fVar217 * 6.0 + fVar158 + fVar104 * 4.0) * 0.16666667
    ;
    auVar18._8_4_ =
         (fVar238 * fVar266 * 12.0 + fVar266 * fVar251 * 6.0 + fVar186 + fVar135 * 4.0) * 0.16666667
    ;
    auVar18._12_4_ =
         (fVar239 * fVar267 * 12.0 + fVar267 * fVar240 * 6.0 + fVar187 + fVar136 * 4.0) * 0.16666667
    ;
    auVar18._16_4_ =
         (fVar241 * fVar268 * 12.0 + fVar268 * 0.0 * 6.0 + fVar137 * 4.0 + 0.0) * 0.16666667;
    auVar18._20_4_ =
         (fVar242 * fVar269 * 12.0 + fVar269 * 0.0 * 6.0 + fVar138 * 4.0 + 0.0) * 0.16666667;
    auVar18._24_4_ =
         (fVar248 * fVar270 * 12.0 + fVar270 * 0.0 * 6.0 + fVar139 * 4.0 + 0.0) * 0.16666667;
    auVar18._28_4_ = fVar250;
    auVar19._4_4_ =
         (fVar185 * 4.0 + fVar134 + fVar265 * fVar219 * 12.0 + fVar218 * fVar265 * 6.0) * 0.16666667
    ;
    auVar19._0_4_ =
         (fVar158 * 4.0 + fVar104 + fVar256 * fVar217 * 12.0 + fVar204 * fVar256 * 6.0) * 0.16666667
    ;
    auVar19._8_4_ =
         (fVar186 * 4.0 + fVar135 + fVar266 * fVar251 * 12.0 + fVar238 * fVar266 * 6.0) * 0.16666667
    ;
    auVar19._12_4_ =
         (fVar187 * 4.0 + fVar136 + fVar267 * fVar240 * 12.0 + fVar239 * fVar267 * 6.0) * 0.16666667
    ;
    auVar19._16_4_ = (fVar137 + 0.0 + fVar268 * 0.0 * 12.0 + fVar241 * fVar268 * 6.0) * 0.16666667;
    auVar19._20_4_ = (fVar138 + 0.0 + fVar269 * 0.0 * 12.0 + fVar242 * fVar269 * 6.0) * 0.16666667;
    auVar19._24_4_ = (fVar139 + 0.0 + fVar270 * 0.0 * 12.0 + fVar248 * fVar270 * 6.0) * 0.16666667;
    auVar19._28_4_ = auVar288._28_4_;
    fVar158 = fVar158 * 0.16666667;
    fVar185 = fVar185 * 0.16666667;
    fVar186 = fVar186 * 0.16666667;
    fVar187 = fVar187 * 0.16666667;
    auVar20._4_4_ = fVar185 * fStack_61c;
    auVar20._0_4_ = fVar158 * local_620;
    auVar20._8_4_ = fVar186 * fStack_618;
    auVar20._12_4_ = fVar187 * fStack_614;
    auVar20._16_4_ = fStack_610 * 0.0;
    auVar20._20_4_ = fStack_60c * 0.0;
    auVar20._24_4_ = fStack_608 * 0.0;
    auVar20._28_4_ = local_8a0._0_4_;
    auVar21._4_4_ = local_240._4_4_ * fVar185;
    auVar21._0_4_ = (float)local_240 * fVar158;
    auVar21._8_4_ = (float)uStack_238 * fVar186;
    auVar21._12_4_ = uStack_238._4_4_ * fVar187;
    auVar21._16_4_ = (float)uStack_230 * 0.0;
    auVar21._20_4_ = uStack_230._4_4_ * 0.0;
    auVar21._24_4_ = (float)uStack_228 * 0.0;
    auVar21._28_4_ = 0x3e2aaaab;
    auVar22._4_4_ = fVar185 * local_5a0._4_4_;
    auVar22._0_4_ = fVar158 * (float)local_5a0;
    auVar22._8_4_ = fVar186 * (float)uStack_598;
    auVar22._12_4_ = fVar187 * uStack_598._4_4_;
    auVar22._16_4_ = (float)uStack_590 * 0.0;
    auVar22._20_4_ = uStack_590._4_4_ * 0.0;
    auVar22._24_4_ = (float)uStack_588 * 0.0;
    auVar22._28_4_ = fVar276 + 0.0;
    auVar23._4_4_ = fVar185 * local_5c0._4_4_;
    auVar23._0_4_ = fVar158 * (float)local_5c0;
    auVar23._8_4_ = fVar186 * (float)uStack_5b8;
    auVar23._12_4_ = fVar187 * uStack_5b8._4_4_;
    auVar23._16_4_ = (float)uStack_5b0 * 0.0;
    auVar23._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_5a8 * 0.0;
    auVar23._28_4_ = fVar277 + fVar250 + fVar189;
    auVar88._4_4_ = uStack_27c;
    auVar88._0_4_ = local_280;
    auVar88._8_4_ = uStack_278;
    auVar88._12_4_ = uStack_274;
    auVar88._16_4_ = uStack_270;
    auVar88._20_4_ = uStack_26c;
    auVar88._24_4_ = uStack_268;
    auVar88._28_4_ = uStack_264;
    auVar111 = vfmadd231ps_fma(auVar20,auVar19,auVar88);
    auVar89._8_8_ = uStack_218;
    auVar89._0_8_ = local_220;
    auVar89._16_8_ = uStack_210;
    auVar89._24_8_ = uStack_208;
    auVar5 = vfmadd231ps_fma(auVar21,auVar19,auVar89);
    auVar75._8_8_ = uStack_558;
    auVar75._0_8_ = local_560;
    auVar75._16_8_ = uStack_550;
    auVar75._24_8_ = uStack_548;
    auVar291 = vfmadd231ps_fma(auVar22,auVar19,auVar75);
    auVar73._8_8_ = uStack_578;
    auVar73._0_8_ = local_580;
    auVar73._16_8_ = uStack_570;
    auVar73._24_8_ = uStack_568;
    auVar107 = vfmadd231ps_fma(auVar23,auVar19,auVar73);
    auVar69._4_4_ = uStack_5fc;
    auVar69._0_4_ = local_600;
    auVar69._8_4_ = uStack_5f8;
    auVar69._12_4_ = uStack_5f4;
    auVar69._16_4_ = uStack_5f0;
    auVar69._20_4_ = uStack_5ec;
    auVar69._24_4_ = uStack_5e8;
    auVar69._28_4_ = uStack_5e4;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar18,auVar69);
    auVar90._8_8_ = uStack_1f8;
    auVar90._0_8_ = local_200;
    auVar90._16_8_ = uStack_1f0;
    auVar90._24_8_ = uStack_1e8;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar18,auVar90);
    auVar79._8_8_ = uStack_518;
    auVar79._0_8_ = local_520;
    auVar79._16_8_ = uStack_510;
    auVar79._24_8_ = uStack_508;
    auVar291 = vfmadd231ps_fma(ZEXT1632(auVar291),auVar18,auVar79);
    auVar77._8_8_ = uStack_538;
    auVar77._0_8_ = local_540;
    auVar77._16_8_ = uStack_530;
    auVar77._24_8_ = uStack_528;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar18,auVar77);
    auVar71._4_4_ = uStack_5dc;
    auVar71._0_4_ = local_5e0;
    auVar71._8_4_ = uStack_5d8;
    auVar71._12_4_ = uStack_5d4;
    auVar71._16_4_ = uStack_5d0;
    auVar71._20_4_ = uStack_5cc;
    auVar71._24_4_ = uStack_5c8;
    auVar71._28_4_ = uStack_5c4;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar17,auVar71);
    auVar116 = ZEXT1632(auVar111);
    auVar91._8_8_ = uStack_1d8;
    auVar91._0_8_ = local_1e0;
    auVar91._16_8_ = uStack_1d0;
    auVar91._24_8_ = uStack_1c8;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar17,auVar91);
    auVar83._8_8_ = uStack_4d8;
    auVar83._0_8_ = local_4e0;
    auVar83._16_8_ = uStack_4d0;
    auVar83._24_8_ = uStack_4c8;
    auVar111 = vfmadd231ps_fma(ZEXT1632(auVar291),auVar17,auVar83);
    auVar81._8_8_ = uStack_4f8;
    auVar81._0_8_ = local_500;
    auVar81._16_8_ = uStack_4f0;
    auVar81._24_8_ = uStack_4e8;
    auVar291 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar17,auVar81);
    auVar232._0_4_ = -fVar217 * fVar217;
    auVar232._4_4_ = -fVar219 * fVar219;
    auVar232._8_4_ = -fVar251 * fVar251;
    auVar232._12_4_ = -fVar240 * fVar240;
    auVar232._16_4_ = 0x80000000;
    auVar232._20_4_ = 0x80000000;
    auVar232._24_4_ = 0x80000000;
    auVar232._28_4_ = 0;
    auVar24._4_4_ = fVar265 * 4.0;
    auVar24._0_4_ = fVar256 * 4.0;
    auVar24._8_4_ = fVar266 * 4.0;
    auVar24._12_4_ = fVar267 * 4.0;
    auVar24._16_4_ = fVar268 * 4.0;
    auVar24._20_4_ = fVar269 * 4.0;
    fVar189 = auVar264._28_4_;
    auVar24._24_4_ = fVar270 * 4.0;
    auVar24._28_4_ = fVar189;
    auVar12 = vsubps_avx(auVar232,auVar24);
    fVar104 = fVar189 + auVar247._28_4_;
    auVar25._4_4_ = fVar218 * -fVar218 * 0.5;
    auVar25._0_4_ = fVar204 * -fVar204 * 0.5;
    auVar25._8_4_ = fVar238 * -fVar238 * 0.5;
    auVar25._12_4_ = fVar239 * -fVar239 * 0.5;
    auVar25._16_4_ = fVar241 * -fVar241 * 0.5;
    auVar25._20_4_ = fVar242 * -fVar242 * 0.5;
    auVar25._24_4_ = fVar248 * -fVar248 * 0.5;
    auVar25._28_4_ = auVar126._28_4_;
    auVar126._4_4_ = auVar12._4_4_ * 0.5;
    auVar126._0_4_ = auVar12._0_4_ * 0.5;
    auVar126._8_4_ = auVar12._8_4_ * 0.5;
    auVar126._12_4_ = auVar12._12_4_ * 0.5;
    auVar126._16_4_ = auVar12._16_4_ * 0.5;
    auVar126._20_4_ = auVar12._20_4_ * 0.5;
    auVar126._24_4_ = auVar12._24_4_ * 0.5;
    auVar126._28_4_ = auVar12._28_4_;
    auVar26._4_4_ = (fVar265 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar26._0_4_ = (fVar256 * 4.0 + fVar204 * fVar204) * 0.5;
    auVar26._8_4_ = (fVar266 * 4.0 + fVar238 * fVar238) * 0.5;
    auVar26._12_4_ = (fVar267 * 4.0 + fVar239 * fVar239) * 0.5;
    auVar26._16_4_ = (fVar268 * 4.0 + fVar241 * fVar241) * 0.5;
    auVar26._20_4_ = (fVar269 * 4.0 + fVar242 * fVar242) * 0.5;
    auVar26._24_4_ = (fVar270 * 4.0 + fVar248 * fVar248) * 0.5;
    auVar26._28_4_ = fVar104;
    fVar204 = fVar217 * fVar217 * 0.5;
    fVar217 = fVar219 * fVar219 * 0.5;
    fVar218 = fVar251 * fVar251 * 0.5;
    fVar219 = fVar240 * fVar240 * 0.5;
    auVar27._4_4_ = fVar217 * fStack_61c;
    auVar27._0_4_ = fVar204 * local_620;
    auVar27._8_4_ = fVar218 * fStack_618;
    auVar27._12_4_ = fVar219 * fStack_614;
    auVar27._16_4_ = fStack_610 * 0.0;
    auVar27._20_4_ = fStack_60c * 0.0;
    auVar27._24_4_ = fStack_608 * 0.0;
    auVar27._28_4_ = fVar189;
    auVar28._4_4_ = local_240._4_4_ * fVar217;
    auVar28._0_4_ = (float)local_240 * fVar204;
    auVar28._8_4_ = (float)uStack_238 * fVar218;
    auVar28._12_4_ = uStack_238._4_4_ * fVar219;
    auVar28._16_4_ = (float)uStack_230 * 0.0;
    auVar28._20_4_ = uStack_230._4_4_ * 0.0;
    auVar28._24_4_ = (float)uStack_228 * 0.0;
    auVar28._28_4_ = 0x80000000;
    auVar29._4_4_ = fVar217 * local_5a0._4_4_;
    auVar29._0_4_ = fVar204 * (float)local_5a0;
    auVar29._8_4_ = fVar218 * (float)uStack_598;
    auVar29._12_4_ = fVar219 * uStack_598._4_4_;
    auVar29._16_4_ = (float)uStack_590 * 0.0;
    auVar29._20_4_ = uStack_590._4_4_ * 0.0;
    auVar29._24_4_ = (float)uStack_588 * 0.0;
    auVar29._28_4_ = fVar250;
    auVar30._4_4_ = fVar217 * local_5c0._4_4_;
    auVar30._0_4_ = fVar204 * (float)local_5c0;
    auVar30._8_4_ = fVar218 * (float)uStack_5b8;
    auVar30._12_4_ = fVar219 * uStack_5b8._4_4_;
    auVar30._16_4_ = (float)uStack_5b0 * 0.0;
    auVar30._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar30._24_4_ = (float)uStack_5a8 * 0.0;
    auVar30._28_4_ = DAT_01f7b040._28_4_;
    auVar107 = vfmadd231ps_fma(auVar27,auVar26,auVar88);
    auVar221 = vfmadd231ps_fma(auVar28,auVar26,auVar89);
    auVar76._8_8_ = uStack_558;
    auVar76._0_8_ = local_560;
    auVar76._16_8_ = uStack_550;
    auVar76._24_8_ = uStack_548;
    auVar169 = vfmadd231ps_fma(auVar29,auVar26,auVar76);
    auVar74._8_8_ = uStack_578;
    auVar74._0_8_ = local_580;
    auVar74._16_8_ = uStack_570;
    auVar74._24_8_ = uStack_568;
    auVar231 = vfmadd231ps_fma(auVar30,auVar26,auVar74);
    auVar70._4_4_ = uStack_5fc;
    auVar70._0_4_ = local_600;
    auVar70._8_4_ = uStack_5f8;
    auVar70._12_4_ = uStack_5f4;
    auVar70._16_4_ = uStack_5f0;
    auVar70._20_4_ = uStack_5ec;
    auVar70._24_4_ = uStack_5e8;
    auVar70._28_4_ = uStack_5e4;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar126,auVar70);
    auVar221 = vfmadd231ps_fma(ZEXT1632(auVar221),auVar126,auVar90);
    auVar80._8_8_ = uStack_518;
    auVar80._0_8_ = local_520;
    auVar80._16_8_ = uStack_510;
    auVar80._24_8_ = uStack_508;
    auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar126,auVar80);
    auVar78._8_8_ = uStack_538;
    auVar78._0_8_ = local_540;
    auVar78._16_8_ = uStack_530;
    auVar78._24_8_ = uStack_528;
    auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar126,auVar78);
    auVar72._4_4_ = uStack_5dc;
    auVar72._0_4_ = local_5e0;
    auVar72._8_4_ = uStack_5d8;
    auVar72._12_4_ = uStack_5d4;
    auVar72._16_4_ = uStack_5d0;
    auVar72._20_4_ = uStack_5cc;
    auVar72._24_4_ = uStack_5c8;
    auVar72._28_4_ = uStack_5c4;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar25,auVar72);
    auVar221 = vfmadd231ps_fma(ZEXT1632(auVar221),auVar25,auVar91);
    auVar84._8_8_ = uStack_4d8;
    auVar84._0_8_ = local_4e0;
    auVar84._16_8_ = uStack_4d0;
    auVar84._24_8_ = uStack_4c8;
    auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar25,auVar84);
    auVar82._8_8_ = uStack_4f8;
    auVar82._0_8_ = local_500;
    auVar82._16_8_ = uStack_4f0;
    auVar82._24_8_ = uStack_4e8;
    auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar25,auVar82);
    local_840._0_4_ = auVar107._0_4_ * fVar249;
    local_840._4_4_ = auVar107._4_4_ * fVar249;
    local_840._8_4_ = auVar107._8_4_ * fVar249;
    local_840._12_4_ = auVar107._12_4_ * fVar249;
    local_840._16_4_ = fVar249 * 0.0;
    local_840._20_4_ = fVar249 * 0.0;
    local_840._24_4_ = fVar249 * 0.0;
    local_840._28_4_ = 0;
    local_860._0_4_ = auVar221._0_4_ * fVar249;
    local_860._4_4_ = auVar221._4_4_ * fVar249;
    local_860._8_4_ = auVar221._8_4_ * fVar249;
    local_860._12_4_ = auVar221._12_4_ * fVar249;
    local_860._16_4_ = fVar249 * 0.0;
    local_860._20_4_ = fVar249 * 0.0;
    local_860._24_4_ = fVar249 * 0.0;
    local_860._28_4_ = 0;
    auVar279._0_4_ = auVar169._0_4_ * fVar249;
    auVar279._4_4_ = auVar169._4_4_ * fVar249;
    auVar279._8_4_ = auVar169._8_4_ * fVar249;
    auVar279._12_4_ = auVar169._12_4_ * fVar249;
    auVar279._16_4_ = fVar249 * 0.0;
    auVar279._20_4_ = fVar249 * 0.0;
    auVar279._24_4_ = fVar249 * 0.0;
    auVar279._28_4_ = 0;
    fVar189 = fVar249 * auVar231._0_4_;
    fVar204 = fVar249 * auVar231._4_4_;
    auVar31._4_4_ = fVar204;
    auVar31._0_4_ = fVar189;
    fVar217 = fVar249 * auVar231._8_4_;
    auVar31._8_4_ = fVar217;
    fVar218 = fVar249 * auVar231._12_4_;
    auVar31._12_4_ = fVar218;
    auVar31._16_4_ = fVar249 * 0.0;
    auVar31._20_4_ = fVar249 * 0.0;
    auVar31._24_4_ = fVar249 * 0.0;
    auVar31._28_4_ = fVar249;
    auVar180 = vpermps_avx2(_DAT_01fb7720,auVar116);
    auVar149 = ZEXT1632(auVar111);
    local_820 = vpermps_avx2(_DAT_01fb7720,auVar149);
    local_2e0 = vsubps_avx(auVar180,auVar116);
    local_2c0 = vsubps_avx(local_820,ZEXT1632(auVar111));
    fVar239 = local_2c0._0_4_;
    fVar240 = local_2c0._4_4_;
    auVar32._4_4_ = fVar240 * local_840._4_4_;
    auVar32._0_4_ = fVar239 * local_840._0_4_;
    fVar241 = local_2c0._8_4_;
    auVar32._8_4_ = fVar241 * local_840._8_4_;
    fVar242 = local_2c0._12_4_;
    auVar32._12_4_ = fVar242 * local_840._12_4_;
    fVar135 = local_2c0._16_4_;
    auVar32._16_4_ = fVar135 * local_840._16_4_;
    fVar136 = local_2c0._20_4_;
    auVar32._20_4_ = fVar136 * local_840._20_4_;
    fVar137 = local_2c0._24_4_;
    auVar32._24_4_ = fVar137 * local_840._24_4_;
    auVar32._28_4_ = local_820._28_4_;
    auVar111 = vfmsub231ps_fma(auVar32,auVar279,local_2e0);
    auVar246 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar5));
    local_300 = vsubps_avx(auVar246,ZEXT1632(auVar5));
    fVar186 = local_2e0._0_4_;
    fVar187 = local_2e0._4_4_;
    auVar33._4_4_ = fVar187 * local_860._4_4_;
    auVar33._0_4_ = fVar186 * (float)local_860._0_4_;
    fVar256 = local_2e0._8_4_;
    auVar33._8_4_ = fVar256 * local_860._8_4_;
    fVar265 = local_2e0._12_4_;
    auVar33._12_4_ = fVar265 * local_860._12_4_;
    fVar266 = local_2e0._16_4_;
    auVar33._16_4_ = fVar266 * local_860._16_4_;
    fVar267 = local_2e0._20_4_;
    auVar33._20_4_ = fVar267 * local_860._20_4_;
    fVar268 = local_2e0._24_4_;
    auVar33._24_4_ = fVar268 * local_860._24_4_;
    auVar33._28_4_ = 0;
    auVar107 = vfmsub231ps_fma(auVar33,local_840,local_300);
    auVar111 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * auVar107._12_4_,
                                                  CONCAT48(auVar107._8_4_ * auVar107._8_4_,
                                                           CONCAT44(auVar107._4_4_ * auVar107._4_4_,
                                                                    auVar107._0_4_ * auVar107._0_4_)
                                                          ))),ZEXT1632(auVar111),ZEXT1632(auVar111))
    ;
    auVar213._0_4_ = fVar239 * fVar239;
    auVar213._4_4_ = fVar240 * fVar240;
    auVar213._8_4_ = fVar241 * fVar241;
    auVar213._12_4_ = fVar242 * fVar242;
    auVar213._16_4_ = fVar135 * fVar135;
    auVar213._20_4_ = fVar136 * fVar136;
    auVar213._24_4_ = fVar137 * fVar137;
    auVar213._28_4_ = 0;
    auVar107 = vfmadd231ps_fma(auVar213,local_300,local_300);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_2e0,local_2e0);
    fVar248 = local_300._0_4_;
    fVar250 = local_300._4_4_;
    auVar34._4_4_ = fVar250 * auVar279._4_4_;
    auVar34._0_4_ = fVar248 * auVar279._0_4_;
    fVar134 = local_300._8_4_;
    auVar34._8_4_ = fVar134 * auVar279._8_4_;
    fVar138 = local_300._12_4_;
    auVar34._12_4_ = fVar138 * auVar279._12_4_;
    fVar139 = local_300._16_4_;
    auVar34._16_4_ = fVar139 * auVar279._16_4_;
    fVar158 = local_300._20_4_;
    auVar34._20_4_ = fVar158 * auVar279._20_4_;
    fVar185 = local_300._24_4_;
    auVar34._24_4_ = fVar185 * auVar279._24_4_;
    auVar34._28_4_ = fVar104;
    auVar126 = vrcpps_avx(ZEXT1632(auVar107));
    auVar221 = vfmsub231ps_fma(auVar34,local_860,local_2c0);
    auVar221 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT1632(auVar221),ZEXT1632(auVar221));
    auVar175._8_4_ = 0x3f800000;
    auVar175._0_8_ = 0x3f8000003f800000;
    auVar175._12_4_ = 0x3f800000;
    auVar175._16_4_ = 0x3f800000;
    auVar175._20_4_ = 0x3f800000;
    auVar175._24_4_ = 0x3f800000;
    auVar175._28_4_ = 0x3f800000;
    auVar111 = vfnmadd213ps_fma(auVar126,ZEXT1632(auVar107),auVar175);
    auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar126,auVar126);
    auVar147 = vpermps_avx2(_DAT_01fb7720,local_840);
    local_9a0 = vpermps_avx2(_DAT_01fb7720,auVar279);
    auVar35._4_4_ = fVar240 * auVar147._4_4_;
    auVar35._0_4_ = fVar239 * auVar147._0_4_;
    auVar35._8_4_ = fVar241 * auVar147._8_4_;
    auVar35._12_4_ = fVar242 * auVar147._12_4_;
    auVar35._16_4_ = fVar135 * auVar147._16_4_;
    auVar35._20_4_ = fVar136 * auVar147._20_4_;
    auVar35._24_4_ = fVar137 * auVar147._24_4_;
    auVar35._28_4_ = auVar126._28_4_;
    auVar169 = vfmsub231ps_fma(auVar35,local_9a0,local_2e0);
    local_9c0 = vpermps_avx2(_DAT_01fb7720,local_860);
    auVar36._4_4_ = fVar187 * local_9c0._4_4_;
    auVar36._0_4_ = fVar186 * local_9c0._0_4_;
    auVar36._8_4_ = fVar256 * local_9c0._8_4_;
    auVar36._12_4_ = fVar265 * local_9c0._12_4_;
    auVar36._16_4_ = fVar266 * local_9c0._16_4_;
    auVar36._20_4_ = fVar267 * local_9c0._20_4_;
    auVar36._24_4_ = fVar268 * local_9c0._24_4_;
    auVar36._28_4_ = 0;
    auVar231 = vfmsub231ps_fma(auVar36,auVar147,local_300);
    auVar169 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar231._12_4_ * auVar231._12_4_,
                                                  CONCAT48(auVar231._8_4_ * auVar231._8_4_,
                                                           CONCAT44(auVar231._4_4_ * auVar231._4_4_,
                                                                    auVar231._0_4_ * auVar231._0_4_)
                                                          ))),ZEXT1632(auVar169),ZEXT1632(auVar169))
    ;
    auVar253._0_4_ = fVar248 * local_9a0._0_4_;
    auVar253._4_4_ = fVar250 * local_9a0._4_4_;
    auVar253._8_4_ = fVar134 * local_9a0._8_4_;
    auVar253._12_4_ = fVar138 * local_9a0._12_4_;
    auVar253._16_4_ = fVar139 * local_9a0._16_4_;
    auVar253._20_4_ = fVar158 * local_9a0._20_4_;
    auVar253._24_4_ = fVar185 * local_9a0._24_4_;
    auVar253._28_4_ = 0;
    auVar231 = vfmsub231ps_fma(auVar253,local_9c0,local_2c0);
    auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),ZEXT1632(auVar231),ZEXT1632(auVar231));
    auVar126 = vmaxps_avx(ZEXT1632(CONCAT412(auVar221._12_4_ * auVar111._12_4_,
                                             CONCAT48(auVar221._8_4_ * auVar111._8_4_,
                                                      CONCAT44(auVar221._4_4_ * auVar111._4_4_,
                                                               auVar221._0_4_ * auVar111._0_4_)))),
                          ZEXT1632(CONCAT412(auVar169._12_4_ * auVar111._12_4_,
                                             CONCAT48(auVar169._8_4_ * auVar111._8_4_,
                                                      CONCAT44(auVar169._4_4_ * auVar111._4_4_,
                                                               auVar169._0_4_ * auVar111._0_4_)))));
    local_8c0._0_4_ = fVar189 + auVar291._0_4_;
    local_8c0._4_4_ = fVar204 + auVar291._4_4_;
    local_8c0._8_4_ = fVar217 + auVar291._8_4_;
    local_8c0._12_4_ = fVar218 + auVar291._12_4_;
    local_8c0._16_4_ = fVar249 * 0.0 + 0.0;
    local_8c0._20_4_ = fVar249 * 0.0 + 0.0;
    local_8c0._24_4_ = fVar249 * 0.0 + 0.0;
    local_8c0._28_4_ = fVar249 + 0.0;
    auVar12 = vsubps_avx(ZEXT1632(auVar291),auVar31);
    auVar148 = vpermps_avx2(_DAT_01fb7720,auVar12);
    auVar226 = ZEXT1632(auVar291);
    auVar174 = vpermps_avx2(_DAT_01fb7720,auVar226);
    auVar12 = vmaxps_avx(auVar226,local_8c0);
    auVar118 = vrsqrtps_avx(ZEXT1632(auVar107));
    auVar13 = vmaxps_avx(auVar148,auVar174);
    auVar13 = vmaxps_avx(auVar12,auVar13);
    fVar189 = auVar118._0_4_;
    fVar204 = auVar118._4_4_;
    fVar217 = auVar118._8_4_;
    fVar218 = auVar118._12_4_;
    fVar219 = auVar118._16_4_;
    fVar238 = auVar118._20_4_;
    fVar251 = auVar118._24_4_;
    auVar227._0_4_ = fVar189 * fVar189 * fVar189 * auVar107._0_4_ * -0.5;
    auVar227._4_4_ = fVar204 * fVar204 * fVar204 * auVar107._4_4_ * -0.5;
    auVar227._8_4_ = fVar217 * fVar217 * fVar217 * auVar107._8_4_ * -0.5;
    auVar227._12_4_ = fVar218 * fVar218 * fVar218 * auVar107._12_4_ * -0.5;
    auVar227._16_4_ = fVar219 * fVar219 * fVar219 * -0.0;
    auVar227._20_4_ = fVar238 * fVar238 * fVar238 * -0.0;
    auVar227._24_4_ = fVar251 * fVar251 * fVar251 * -0.0;
    auVar227._28_4_ = 0;
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar111 = vfmadd231ps_fma(auVar227,auVar117,auVar118);
    fVar204 = auVar111._0_4_;
    fVar217 = auVar111._4_4_;
    auVar37._4_4_ = fVar250 * fVar217;
    auVar37._0_4_ = fVar248 * fVar204;
    fVar219 = auVar111._8_4_;
    auVar37._8_4_ = fVar134 * fVar219;
    fVar251 = auVar111._12_4_;
    auVar37._12_4_ = fVar138 * fVar251;
    auVar37._16_4_ = fVar139 * 0.0;
    auVar37._20_4_ = fVar158 * 0.0;
    auVar37._24_4_ = fVar185 * 0.0;
    auVar37._28_4_ = auVar12._28_4_;
    auVar38._4_4_ = (float)local_740._4_4_ * fVar240 * fVar217;
    auVar38._0_4_ = (float)local_740._0_4_ * fVar239 * fVar204;
    auVar38._8_4_ = fStack_738 * fVar241 * fVar219;
    auVar38._12_4_ = fStack_734 * fVar242 * fVar251;
    auVar38._16_4_ = fStack_730 * fVar135 * 0.0;
    auVar38._20_4_ = fStack_72c * fVar136 * 0.0;
    auVar38._24_4_ = fStack_728 * fVar137 * 0.0;
    auVar38._28_4_ = local_2c0._28_4_;
    auVar291 = vfmadd231ps_fma(auVar38,auVar37,_local_720);
    auVar118 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar12 = vsubps_avx(auVar118,auVar149);
    fVar248 = auVar12._0_4_;
    fVar249 = auVar12._4_4_;
    auVar39._4_4_ = fVar249 * fVar240 * fVar217;
    auVar39._0_4_ = fVar248 * fVar239 * fVar204;
    fVar250 = auVar12._8_4_;
    auVar39._8_4_ = fVar250 * fVar241 * fVar219;
    fVar104 = auVar12._12_4_;
    auVar39._12_4_ = fVar104 * fVar242 * fVar251;
    fVar134 = auVar12._16_4_;
    auVar39._16_4_ = fVar134 * fVar135 * 0.0;
    fVar135 = auVar12._20_4_;
    auVar39._20_4_ = fVar135 * fVar136 * 0.0;
    fVar136 = auVar12._24_4_;
    auVar39._24_4_ = fVar136 * fVar137 * 0.0;
    auVar39._28_4_ = local_300._28_4_;
    local_2a0 = ZEXT1632(auVar5);
    auVar118 = vsubps_avx(auVar118,local_2a0);
    auVar247 = ZEXT3264(auVar118);
    auVar5 = vfmadd231ps_fma(auVar39,auVar118,auVar37);
    auVar40._4_4_ = fVar187 * fVar217;
    auVar40._0_4_ = fVar186 * fVar204;
    auVar40._8_4_ = fVar256 * fVar219;
    auVar40._12_4_ = fVar265 * fVar251;
    auVar40._16_4_ = fVar266 * 0.0;
    auVar40._20_4_ = fVar267 * 0.0;
    auVar40._24_4_ = fVar268 * 0.0;
    auVar40._28_4_ = 0;
    auVar291 = vfmadd231ps_fma(ZEXT1632(auVar291),auVar40,_local_700);
    auVar288 = ZEXT1664(auVar291);
    auVar119 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar14 = vsubps_avx(auVar119,auVar116);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar14,auVar40);
    auVar41._4_4_ = fVar249 * (float)local_740._4_4_;
    auVar41._0_4_ = fVar248 * (float)local_740._0_4_;
    auVar41._8_4_ = fVar250 * fStack_738;
    auVar41._12_4_ = fVar104 * fStack_734;
    auVar41._16_4_ = fVar134 * fStack_730;
    auVar41._20_4_ = fVar135 * fStack_72c;
    auVar41._24_4_ = fVar136 * fStack_728;
    auVar41._28_4_ = 0;
    auVar107 = vfmadd231ps_fma(auVar41,_local_720,auVar118);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),_local_700,auVar14);
    fVar189 = auVar5._0_4_;
    fVar137 = auVar291._0_4_;
    fVar218 = auVar5._4_4_;
    fVar138 = auVar291._4_4_;
    fVar238 = auVar5._8_4_;
    fVar139 = auVar291._8_4_;
    fVar239 = auVar5._12_4_;
    fVar158 = auVar291._12_4_;
    uVar99 = local_720._28_4_;
    auVar42._28_4_ = uVar99;
    auVar42._0_28_ =
         ZEXT1628(CONCAT412(fVar158 * fVar239,
                            CONCAT48(fVar139 * fVar238,CONCAT44(fVar138 * fVar218,fVar137 * fVar189)
                                    )));
    auVar233 = vsubps_avx(ZEXT1632(auVar107),auVar42);
    auVar43._4_4_ = fVar249 * fVar249;
    auVar43._0_4_ = fVar248 * fVar248;
    auVar43._8_4_ = fVar250 * fVar250;
    auVar43._12_4_ = fVar104 * fVar104;
    auVar43._16_4_ = fVar134 * fVar134;
    auVar43._20_4_ = fVar135 * fVar135;
    auVar43._24_4_ = fVar136 * fVar136;
    auVar43._28_4_ = uVar99;
    auVar107 = vfmadd231ps_fma(auVar43,auVar118,auVar118);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar14,auVar14);
    auVar15 = vsubps_avx(ZEXT1632(auVar107),
                         ZEXT1632(CONCAT412(fVar239 * fVar239,
                                            CONCAT48(fVar238 * fVar238,
                                                     CONCAT44(fVar218 * fVar218,fVar189 * fVar189)))
                                 ));
    auVar12 = vsqrtps_avx(auVar126);
    fVar189 = (auVar13._0_4_ + auVar12._0_4_) * 1.0000002;
    fVar218 = (auVar13._4_4_ + auVar12._4_4_) * 1.0000002;
    fVar238 = (auVar13._8_4_ + auVar12._8_4_) * 1.0000002;
    fVar239 = (auVar13._12_4_ + auVar12._12_4_) * 1.0000002;
    fVar240 = (auVar13._16_4_ + auVar12._16_4_) * 1.0000002;
    fVar241 = (auVar13._20_4_ + auVar12._20_4_) * 1.0000002;
    fVar242 = (auVar13._24_4_ + auVar12._24_4_) * 1.0000002;
    auVar44._4_4_ = fVar218 * fVar218;
    auVar44._0_4_ = fVar189 * fVar189;
    auVar44._8_4_ = fVar238 * fVar238;
    auVar44._12_4_ = fVar239 * fVar239;
    auVar44._16_4_ = fVar240 * fVar240;
    auVar44._20_4_ = fVar241 * fVar241;
    auVar44._24_4_ = fVar242 * fVar242;
    auVar44._28_4_ = auVar13._28_4_ + auVar12._28_4_;
    local_320._0_4_ = auVar233._0_4_ + auVar233._0_4_;
    local_320._4_4_ = auVar233._4_4_ + auVar233._4_4_;
    local_320._8_4_ = auVar233._8_4_ + auVar233._8_4_;
    local_320._12_4_ = auVar233._12_4_ + auVar233._12_4_;
    local_320._16_4_ = auVar233._16_4_ + auVar233._16_4_;
    local_320._20_4_ = auVar233._20_4_ + auVar233._20_4_;
    local_320._24_4_ = auVar233._24_4_ + auVar233._24_4_;
    fVar189 = auVar233._28_4_;
    local_320._28_4_ = fVar189 + fVar189;
    auVar13 = vsubps_avx(auVar15,auVar44);
    auVar258 = ZEXT1632(auVar291);
    auVar9._28_4_ = 0x3f800002;
    auVar9._0_28_ =
         ZEXT1628(CONCAT412(fVar158 * fVar158,
                            CONCAT48(fVar139 * fVar139,CONCAT44(fVar138 * fVar138,fVar137 * fVar137)
                                    )));
    auVar233 = vsubps_avx(local_260,auVar9);
    auVar45._4_4_ = local_320._4_4_ * local_320._4_4_;
    auVar45._0_4_ = local_320._0_4_ * local_320._0_4_;
    auVar45._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar45._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar45._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar45._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar45._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar45._28_4_ = local_260._28_4_;
    fVar218 = auVar233._0_4_;
    fVar238 = auVar233._4_4_;
    fVar239 = auVar233._8_4_;
    fVar240 = auVar233._12_4_;
    fVar241 = auVar233._16_4_;
    fVar242 = auVar233._20_4_;
    fVar137 = auVar233._24_4_;
    auVar46._4_4_ = auVar13._4_4_ * fVar238 * 4.0;
    auVar46._0_4_ = auVar13._0_4_ * fVar218 * 4.0;
    auVar46._8_4_ = auVar13._8_4_ * fVar239 * 4.0;
    auVar46._12_4_ = auVar13._12_4_ * fVar240 * 4.0;
    auVar46._16_4_ = auVar13._16_4_ * fVar241 * 4.0;
    auVar46._20_4_ = auVar13._20_4_ * fVar242 * 4.0;
    auVar46._24_4_ = auVar13._24_4_ * fVar137 * 4.0;
    auVar46._28_4_ = fVar189;
    auVar123 = vsubps_avx(auVar45,auVar46);
    auVar126 = vcmpps_avx(auVar123,auVar119,5);
    _local_a20 = vandps_avx(auVar9,local_9e0);
    local_960._0_4_ = fVar218 + fVar218;
    local_960._4_4_ = fVar238 + fVar238;
    local_960._8_4_ = fVar239 + fVar239;
    local_960._12_4_ = fVar240 + fVar240;
    local_960._16_4_ = fVar241 + fVar241;
    local_960._20_4_ = fVar242 + fVar242;
    local_960._24_4_ = fVar137 + fVar137;
    local_960._28_4_ = auVar233._28_4_ + auVar233._28_4_;
    local_400 = vandps_avx(auVar233,local_9e0);
    auVar233 = ZEXT1632(auVar5);
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0x7f,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0xbf,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
    {
      auVar280._8_4_ = 0x7f800000;
      auVar280._0_8_ = 0x7f8000007f800000;
      auVar280._12_4_ = 0x7f800000;
      auVar280._16_4_ = 0x7f800000;
      auVar280._20_4_ = 0x7f800000;
      auVar280._24_4_ = 0x7f800000;
      auVar280._28_4_ = 0x7f800000;
      auVar214._8_4_ = 0xff800000;
      auVar214._0_8_ = 0xff800000ff800000;
      auVar214._12_4_ = 0xff800000;
      auVar214._16_4_ = 0xff800000;
      auVar214._20_4_ = 0xff800000;
      auVar214._24_4_ = 0xff800000;
      auVar214._28_4_ = 0xff800000;
    }
    else {
      auVar292 = vsqrtps_avx(auVar123);
      auVar245 = vrcpps_avx(local_960);
      auVar123 = vcmpps_avx(auVar123,auVar119,5);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = 0x3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar120._16_4_ = 0x3f800000;
      auVar120._20_4_ = 0x3f800000;
      auVar120._24_4_ = 0x3f800000;
      auVar120._28_4_ = 0x3f800000;
      auVar5 = vfnmadd213ps_fma(auVar245,local_960,auVar120);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar245,auVar245);
      uVar98 = CONCAT44(local_320._4_4_,local_320._0_4_);
      auVar296._0_8_ = uVar98 ^ 0x8000000080000000;
      auVar296._8_4_ = -local_320._8_4_;
      auVar296._12_4_ = -local_320._12_4_;
      auVar296._16_4_ = -local_320._16_4_;
      auVar296._20_4_ = -local_320._20_4_;
      auVar296._24_4_ = -local_320._24_4_;
      auVar296._28_4_ = -local_320._28_4_;
      auVar119 = vsubps_avx(auVar296,auVar292);
      auVar47._4_4_ = auVar119._4_4_ * auVar5._4_4_;
      auVar47._0_4_ = auVar119._0_4_ * auVar5._0_4_;
      auVar47._8_4_ = auVar119._8_4_ * auVar5._8_4_;
      auVar47._12_4_ = auVar119._12_4_ * auVar5._12_4_;
      auVar47._16_4_ = auVar119._16_4_ * 0.0;
      auVar47._20_4_ = auVar119._20_4_ * 0.0;
      auVar47._24_4_ = auVar119._24_4_ * 0.0;
      auVar47._28_4_ = auVar119._28_4_;
      auVar119 = vsubps_avx(auVar292,local_320);
      auVar215._0_4_ = auVar119._0_4_ * auVar5._0_4_;
      auVar215._4_4_ = auVar119._4_4_ * auVar5._4_4_;
      auVar215._8_4_ = auVar119._8_4_ * auVar5._8_4_;
      auVar215._12_4_ = auVar119._12_4_ * auVar5._12_4_;
      auVar215._16_4_ = auVar119._16_4_ * 0.0;
      auVar215._20_4_ = auVar119._20_4_ * 0.0;
      auVar215._24_4_ = auVar119._24_4_ * 0.0;
      auVar215._28_4_ = 0;
      auVar5 = vfmadd213ps_fma(auVar258,auVar47,auVar233);
      local_3c0 = auVar5._0_4_ * fVar204;
      fStack_3bc = auVar5._4_4_ * fVar217;
      fStack_3b8 = auVar5._8_4_ * fVar219;
      fStack_3b4 = auVar5._12_4_ * fVar251;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      uStack_3a4 = 0x80000000;
      auVar5 = vfmadd213ps_fma(auVar258,auVar215,auVar233);
      local_3a0 = auVar5._0_4_ * fVar204;
      fStack_39c = auVar5._4_4_ * fVar217;
      fStack_398 = auVar5._8_4_ * fVar219;
      fStack_394 = auVar5._12_4_ * fVar251;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 0x80000000;
      auVar121._8_4_ = 0x7f800000;
      auVar121._0_8_ = 0x7f8000007f800000;
      auVar121._12_4_ = 0x7f800000;
      auVar121._16_4_ = 0x7f800000;
      auVar121._20_4_ = 0x7f800000;
      auVar121._24_4_ = 0x7f800000;
      auVar121._28_4_ = 0x7f800000;
      auVar280 = vblendvps_avx(auVar121,auVar47,auVar123);
      auVar122._8_4_ = 0xff800000;
      auVar122._0_8_ = 0xff800000ff800000;
      auVar122._12_4_ = 0xff800000;
      auVar122._16_4_ = 0xff800000;
      auVar122._20_4_ = 0xff800000;
      auVar122._24_4_ = 0xff800000;
      auVar122._28_4_ = 0xff800000;
      auVar214 = vblendvps_avx(auVar122,auVar215,auVar123);
      auVar119 = vmaxps_avx(local_640,_local_a20);
      auVar48._4_4_ = auVar119._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar119._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar119._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar119._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar119._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar119._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar119._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar119._28_4_;
      auVar9 = vcmpps_avx(local_400,auVar48,1);
      auVar119 = auVar123 & auVar9;
      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar119 >> 0x7f,0) != '\0') ||
            (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar119 >> 0xbf,0) != '\0') ||
          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar119[0x1f] < '\0') {
        auVar126 = vandps_avx(auVar9,auVar123);
        auVar119 = vcmpps_avx(auVar13,_DAT_01f7b000,2);
        auVar130._8_4_ = 0x7f800000;
        auVar130._0_8_ = 0x7f8000007f800000;
        auVar130._12_4_ = 0x7f800000;
        auVar130._16_4_ = 0x7f800000;
        auVar130._20_4_ = 0x7f800000;
        auVar130._24_4_ = 0x7f800000;
        auVar130._28_4_ = 0x7f800000;
        auVar297._8_4_ = 0xff800000;
        auVar297._0_8_ = 0xff800000ff800000;
        auVar297._12_4_ = 0xff800000;
        auVar297._16_4_ = 0xff800000;
        auVar297._20_4_ = 0xff800000;
        auVar297._24_4_ = 0xff800000;
        auVar297._28_4_ = 0xff800000;
        auVar13 = vblendvps_avx(auVar130,auVar297,auVar119);
        auVar5 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar9 = vpmovsxwd_avx2(auVar5);
        auVar280 = vblendvps_avx(auVar280,auVar13,auVar9);
        auVar131._8_4_ = 0xff800000;
        auVar131._0_8_ = 0xff800000ff800000;
        auVar131._12_4_ = 0xff800000;
        auVar131._16_4_ = 0xff800000;
        auVar131._20_4_ = 0xff800000;
        auVar131._24_4_ = 0xff800000;
        auVar131._28_4_ = 0xff800000;
        auVar298._8_4_ = 0x7f800000;
        auVar298._0_8_ = 0x7f8000007f800000;
        auVar298._12_4_ = 0x7f800000;
        auVar298._16_4_ = 0x7f800000;
        auVar298._20_4_ = 0x7f800000;
        auVar298._24_4_ = 0x7f800000;
        auVar298._28_4_ = 0x7f800000;
        auVar13 = vblendvps_avx(auVar131,auVar298,auVar119);
        auVar214 = vblendvps_avx(auVar214,auVar13,auVar9);
        auVar236._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
        auVar236._8_4_ = auVar126._8_4_ ^ 0xffffffff;
        auVar236._12_4_ = auVar126._12_4_ ^ 0xffffffff;
        auVar236._16_4_ = auVar126._16_4_ ^ 0xffffffff;
        auVar236._20_4_ = auVar126._20_4_ ^ 0xffffffff;
        auVar236._24_4_ = auVar126._24_4_ ^ 0xffffffff;
        auVar236._28_4_ = auVar126._28_4_ ^ 0xffffffff;
        auVar126 = vorps_avx(auVar119,auVar236);
        auVar126 = vandps_avx(auVar123,auVar126);
      }
    }
    auVar264 = ZEXT3264(auVar9);
    auVar13 = local_340 & auVar126;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0x7f,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar13 >> 0xbf,0) == '\0') &&
        (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f]) {
LAB_0138942e:
      auVar282 = ZEXT3264(auVar280);
      auVar275 = ZEXT3264(local_9e0);
    }
    else {
      local_420 = ZEXT1632(auVar111);
      auVar176 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
      local_3e0 = auVar176;
      fVar189 = *(float *)(ray + k * 4 + 0x80) - (float)local_940._0_4_;
      auVar259._4_4_ = fVar189;
      auVar259._0_4_ = fVar189;
      auVar259._8_4_ = fVar189;
      auVar259._12_4_ = fVar189;
      auVar259._16_4_ = fVar189;
      auVar259._20_4_ = fVar189;
      auVar259._24_4_ = fVar189;
      auVar259._28_4_ = fVar189;
      auVar119 = vminps_avx(auVar259,auVar214);
      auVar66._4_4_ = auVar279._4_4_ * fVar249;
      auVar66._0_4_ = auVar279._0_4_ * fVar248;
      auVar66._8_4_ = auVar279._8_4_ * fVar250;
      auVar66._12_4_ = auVar279._12_4_ * fVar104;
      auVar66._16_4_ = auVar279._16_4_ * fVar134;
      auVar66._20_4_ = auVar279._20_4_ * fVar135;
      auVar66._24_4_ = auVar279._24_4_ * fVar136;
      auVar66._28_4_ = auVar214._28_4_;
      auVar111 = vfmadd213ps_fma(auVar118,local_860,auVar66);
      auVar87._4_4_ = fStack_35c;
      auVar87._0_4_ = local_360;
      auVar87._8_4_ = fStack_358;
      auVar87._12_4_ = fStack_354;
      auVar87._16_4_ = fStack_350;
      auVar87._20_4_ = fStack_34c;
      auVar87._24_4_ = fStack_348;
      auVar87._28_4_ = fStack_344;
      auVar123 = vmaxps_avx(auVar87,auVar280);
      auVar5 = vfmadd213ps_fma(auVar14,local_840,ZEXT1632(auVar111));
      auVar244._0_4_ = (float)local_740._0_4_ * auVar279._0_4_;
      auVar244._4_4_ = (float)local_740._4_4_ * auVar279._4_4_;
      auVar244._8_4_ = fStack_738 * auVar279._8_4_;
      auVar244._12_4_ = fStack_734 * auVar279._12_4_;
      auVar244._16_4_ = fStack_730 * auVar279._16_4_;
      auVar244._20_4_ = fStack_72c * auVar279._20_4_;
      auVar244._24_4_ = fStack_728 * auVar279._24_4_;
      auVar244._28_4_ = 0;
      auVar111 = vfmadd231ps_fma(auVar244,_local_720,local_860);
      auVar291 = vfmadd231ps_fma(ZEXT1632(auVar111),_local_700,local_840);
      auVar13 = vandps_avx(local_9e0,ZEXT1632(auVar291));
      auVar289._8_4_ = 0x219392ef;
      auVar289._0_8_ = 0x219392ef219392ef;
      auVar289._12_4_ = 0x219392ef;
      auVar289._16_4_ = 0x219392ef;
      auVar289._20_4_ = 0x219392ef;
      auVar289._24_4_ = 0x219392ef;
      auVar289._28_4_ = 0x219392ef;
      auVar118 = vcmpps_avx(auVar13,auVar289,1);
      auVar13 = vrcpps_avx(ZEXT1632(auVar291));
      auVar260._8_4_ = 0x3f800000;
      auVar260._0_8_ = 0x3f8000003f800000;
      auVar260._12_4_ = 0x3f800000;
      auVar260._16_4_ = 0x3f800000;
      auVar260._20_4_ = 0x3f800000;
      auVar260._24_4_ = 0x3f800000;
      auVar260._28_4_ = 0x3f800000;
      auVar245 = ZEXT1632(auVar291);
      auVar111 = vfnmadd213ps_fma(auVar13,auVar245,auVar260);
      auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar13,auVar13);
      auVar290._0_8_ = auVar291._0_8_ ^ 0x8000000080000000;
      auVar290._8_4_ = auVar291._8_4_ ^ 0x80000000;
      auVar290._12_4_ = auVar291._12_4_ ^ 0x80000000;
      auVar290._16_4_ = 0x80000000;
      auVar290._20_4_ = 0x80000000;
      auVar290._24_4_ = 0x80000000;
      auVar290._28_4_ = 0x80000000;
      auVar49._4_4_ = auVar111._4_4_ * -auVar5._4_4_;
      auVar49._0_4_ = auVar111._0_4_ * -auVar5._0_4_;
      auVar49._8_4_ = auVar111._8_4_ * -auVar5._8_4_;
      auVar49._12_4_ = auVar111._12_4_ * -auVar5._12_4_;
      auVar49._16_4_ = 0x80000000;
      auVar49._20_4_ = 0x80000000;
      auVar49._24_4_ = 0x80000000;
      auVar49._28_4_ = 0x80000000;
      auVar13 = vcmpps_avx(auVar245,auVar290,1);
      auVar13 = vorps_avx(auVar118,auVar13);
      auVar261._8_4_ = 0xff800000;
      auVar261._0_8_ = 0xff800000ff800000;
      auVar261._12_4_ = 0xff800000;
      auVar261._16_4_ = 0xff800000;
      auVar261._20_4_ = 0xff800000;
      auVar261._24_4_ = 0xff800000;
      auVar261._28_4_ = 0xff800000;
      auVar13 = vblendvps_avx(auVar49,auVar261,auVar13);
      auVar14 = vmaxps_avx(auVar123,auVar13);
      auVar13 = vcmpps_avx(auVar245,auVar290,6);
      auVar13 = vorps_avx(auVar118,auVar13);
      auVar254._8_4_ = 0x7f800000;
      auVar254._0_8_ = 0x7f8000007f800000;
      auVar254._12_4_ = 0x7f800000;
      auVar254._16_4_ = 0x7f800000;
      auVar254._20_4_ = 0x7f800000;
      auVar254._24_4_ = 0x7f800000;
      auVar254._28_4_ = 0x7f800000;
      auVar13 = vblendvps_avx(auVar49,auVar254,auVar13);
      auVar123 = vminps_avx(auVar119,auVar13);
      fVar189 = -local_9a0._0_4_;
      fVar248 = -local_9a0._4_4_;
      fVar249 = -local_9a0._8_4_;
      fVar250 = -local_9a0._12_4_;
      fVar104 = -local_9a0._16_4_;
      fVar134 = -local_9a0._20_4_;
      fVar135 = -local_9a0._24_4_;
      auVar255._0_8_ = local_9c0._0_8_ ^ 0x8000000080000000;
      auVar255._8_4_ = -local_9c0._8_4_;
      auVar255._12_4_ = -local_9c0._12_4_;
      auVar255._16_4_ = -local_9c0._16_4_;
      auVar255._20_4_ = -local_9c0._20_4_;
      auVar255._24_4_ = -local_9c0._24_4_;
      auVar255._28_4_ = local_9c0._28_4_ ^ 0x80000000;
      auVar67 = ZEXT812(0);
      auVar119 = ZEXT1232(auVar67) << 0x20;
      auVar13 = vsubps_avx(ZEXT1232(auVar67) << 0x20,auVar246);
      auVar118 = vsubps_avx(ZEXT1232(auVar67) << 0x20,local_820);
      auVar50._4_4_ = auVar118._4_4_ * fVar248;
      auVar50._0_4_ = auVar118._0_4_ * fVar189;
      auVar50._8_4_ = auVar118._8_4_ * fVar249;
      auVar50._12_4_ = auVar118._12_4_ * fVar250;
      auVar50._16_4_ = auVar118._16_4_ * fVar104;
      auVar50._20_4_ = auVar118._20_4_ * fVar134;
      auVar50._24_4_ = auVar118._24_4_ * fVar135;
      auVar50._28_4_ = auVar118._28_4_;
      auVar111 = vfmadd231ps_fma(auVar50,auVar255,auVar13);
      uStack_b24 = auVar147._28_4_;
      auVar262._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
      auVar262._8_4_ = -auVar147._8_4_;
      auVar262._12_4_ = -auVar147._12_4_;
      auVar262._16_4_ = -auVar147._16_4_;
      auVar262._20_4_ = -auVar147._20_4_;
      auVar262._24_4_ = -auVar147._24_4_;
      auVar262._28_4_ = uStack_b24 ^ 0x80000000;
      auVar13 = vsubps_avx(ZEXT1232(auVar67) << 0x20,auVar180);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar262,auVar13);
      auVar51._4_4_ = (float)local_740._4_4_ * fVar248;
      auVar51._0_4_ = (float)local_740._0_4_ * fVar189;
      auVar51._8_4_ = fStack_738 * fVar249;
      auVar51._12_4_ = fStack_734 * fVar250;
      auVar51._16_4_ = fStack_730 * fVar104;
      auVar51._20_4_ = fStack_72c * fVar134;
      auVar51._24_4_ = fStack_728 * fVar135;
      auVar51._28_4_ = local_9a0._28_4_ ^ 0x80000000;
      auVar111 = vfmadd231ps_fma(auVar51,_local_720,auVar255);
      auVar228._8_4_ = 0x3f800000;
      auVar228._0_8_ = 0x3f8000003f800000;
      auVar228._12_4_ = 0x3f800000;
      auVar228._16_4_ = 0x3f800000;
      auVar228._20_4_ = 0x3f800000;
      auVar228._24_4_ = 0x3f800000;
      auVar228._28_4_ = 0x3f800000;
      auVar291 = vfmadd231ps_fma(ZEXT1632(auVar111),_local_700,auVar262);
      auVar13 = vandps_avx(ZEXT1632(auVar291),local_9e0);
      auVar180 = vrcpps_avx(ZEXT1632(auVar291));
      auVar177._8_4_ = 0x219392ef;
      auVar177._0_8_ = 0x219392ef219392ef;
      auVar177._12_4_ = 0x219392ef;
      auVar177._16_4_ = 0x219392ef;
      auVar177._20_4_ = 0x219392ef;
      auVar177._24_4_ = 0x219392ef;
      auVar177._28_4_ = 0x219392ef;
      auVar118 = vcmpps_avx(auVar13,auVar177,1);
      auVar246 = ZEXT1632(auVar291);
      auVar111 = vfnmadd213ps_fma(auVar180,auVar246,auVar228);
      auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar180,auVar180);
      auVar263._0_8_ = auVar291._0_8_ ^ 0x8000000080000000;
      auVar263._8_4_ = auVar291._8_4_ ^ 0x80000000;
      auVar263._12_4_ = auVar291._12_4_ ^ 0x80000000;
      auVar263._16_4_ = 0x80000000;
      auVar263._20_4_ = 0x80000000;
      auVar263._24_4_ = 0x80000000;
      auVar263._28_4_ = 0x80000000;
      auVar264 = ZEXT3264(auVar263);
      auVar52._4_4_ = auVar111._4_4_ * -auVar5._4_4_;
      auVar52._0_4_ = auVar111._0_4_ * -auVar5._0_4_;
      auVar52._8_4_ = auVar111._8_4_ * -auVar5._8_4_;
      auVar52._12_4_ = auVar111._12_4_ * -auVar5._12_4_;
      auVar52._16_4_ = 0x80000000;
      auVar52._20_4_ = 0x80000000;
      auVar52._24_4_ = 0x80000000;
      auVar52._28_4_ = 0x80000000;
      auVar13 = vcmpps_avx(auVar246,auVar263,1);
      auVar13 = vorps_avx(auVar118,auVar13);
      auVar178._8_4_ = 0xff800000;
      auVar178._0_8_ = 0xff800000ff800000;
      auVar178._12_4_ = 0xff800000;
      auVar178._16_4_ = 0xff800000;
      auVar178._20_4_ = 0xff800000;
      auVar178._24_4_ = 0xff800000;
      auVar178._28_4_ = 0xff800000;
      auVar13 = vblendvps_avx(auVar52,auVar178,auVar13);
      auVar14 = vmaxps_avx(auVar14,auVar13);
      auVar13 = vcmpps_avx(auVar246,auVar263,6);
      auVar13 = vorps_avx(auVar118,auVar13);
      auVar179._8_4_ = 0x7f800000;
      auVar179._0_8_ = 0x7f8000007f800000;
      auVar179._12_4_ = 0x7f800000;
      auVar179._16_4_ = 0x7f800000;
      auVar179._20_4_ = 0x7f800000;
      auVar179._24_4_ = 0x7f800000;
      auVar179._28_4_ = 0x7f800000;
      auVar13 = vblendvps_avx(auVar52,auVar179,auVar13);
      auVar126 = vandps_avx(auVar126,local_340);
      local_440 = vminps_avx(auVar123,auVar13);
      auVar13 = vcmpps_avx(auVar14,local_440,2);
      auVar247 = ZEXT3264(auVar13);
      auVar118 = auVar126 & auVar13;
      auVar280 = _local_740;
      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar118 >> 0x7f,0) == '\0') &&
            (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar118 >> 0xbf,0) == '\0') &&
          (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar118[0x1f]) goto LAB_0138942e;
      auVar85._4_4_ = fStack_3bc;
      auVar85._0_4_ = local_3c0;
      auVar85._8_4_ = fStack_3b8;
      auVar85._12_4_ = fStack_3b4;
      auVar85._16_4_ = uStack_3b0;
      auVar85._20_4_ = uStack_3ac;
      auVar85._24_4_ = uStack_3a8;
      auVar85._28_4_ = uStack_3a4;
      auVar118 = vminps_avx(auVar85,auVar228);
      auVar68 = ZEXT812(0);
      auVar180 = ZEXT1232(auVar68) << 0x20;
      auVar118 = vmaxps_avx(auVar118,ZEXT1232(auVar68) << 0x20);
      auVar86._4_4_ = fStack_39c;
      auVar86._0_4_ = local_3a0;
      auVar86._8_4_ = fStack_398;
      auVar86._12_4_ = fStack_394;
      auVar86._16_4_ = uStack_390;
      auVar86._20_4_ = uStack_38c;
      auVar86._24_4_ = uStack_388;
      auVar86._28_4_ = uStack_384;
      auVar123 = vminps_avx(auVar86,auVar228);
      auVar123 = vmaxps_avx(auVar123,ZEXT1232(auVar68) << 0x20);
      auVar53._4_4_ = (auVar118._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar118._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar118._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar118._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar118._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar118._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar118._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar118._28_4_ + 7.0;
      auVar111 = vfmadd213ps_fma(auVar53,local_8a0,local_880);
      auVar54._4_4_ = (auVar123._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar123._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar123._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar123._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar123._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar123._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar123._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar123._28_4_ + 7.0;
      auVar5 = vfmadd213ps_fma(auVar54,local_8a0,local_880);
      auVar118 = vminps_avx(auVar226,local_8c0);
      auVar123 = vminps_avx(auVar148,auVar174);
      auVar118 = vminps_avx(auVar118,auVar123);
      auVar12 = vsubps_avx(auVar118,auVar12);
      auVar126 = vandps_avx(auVar13,auVar126);
      local_1a0 = ZEXT1632(auVar111);
      local_1c0 = ZEXT1632(auVar5);
      auVar55._4_4_ = auVar12._4_4_ * 0.99999976;
      auVar55._0_4_ = auVar12._0_4_ * 0.99999976;
      auVar55._8_4_ = auVar12._8_4_ * 0.99999976;
      auVar55._12_4_ = auVar12._12_4_ * 0.99999976;
      auVar55._16_4_ = auVar12._16_4_ * 0.99999976;
      auVar55._20_4_ = auVar12._20_4_ * 0.99999976;
      auVar55._24_4_ = auVar12._24_4_ * 0.99999976;
      auVar55._28_4_ = auVar12._28_4_;
      auVar12 = vmaxps_avx(ZEXT1232(auVar67) << 0x20,auVar55);
      auVar56._4_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar56._0_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar56._8_4_ = auVar12._8_4_ * auVar12._8_4_;
      auVar56._12_4_ = auVar12._12_4_ * auVar12._12_4_;
      auVar56._16_4_ = auVar12._16_4_ * auVar12._16_4_;
      auVar56._20_4_ = auVar12._20_4_ * auVar12._20_4_;
      auVar56._24_4_ = auVar12._24_4_ * auVar12._24_4_;
      auVar56._28_4_ = auVar12._28_4_;
      auVar118 = vsubps_avx(auVar15,auVar56);
      auVar57._4_4_ = auVar118._4_4_ * fVar238 * 4.0;
      auVar57._0_4_ = auVar118._0_4_ * fVar218 * 4.0;
      auVar57._8_4_ = auVar118._8_4_ * fVar239 * 4.0;
      auVar57._12_4_ = auVar118._12_4_ * fVar240 * 4.0;
      auVar57._16_4_ = auVar118._16_4_ * fVar241 * 4.0;
      auVar57._20_4_ = auVar118._20_4_ * fVar242 * 4.0;
      auVar57._24_4_ = auVar118._24_4_ * fVar137 * 4.0;
      auVar57._28_4_ = auVar12._28_4_;
      auVar15 = vsubps_avx(auVar45,auVar57);
      auVar12 = vcmpps_avx(auVar15,ZEXT1232(auVar68) << 0x20,5);
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar12 >> 0x7f,0) == '\0') &&
            (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar12 >> 0xbf,0) == '\0') &&
          (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar12[0x1f])
      {
        auVar247 = ZEXT864(0) << 0x20;
        auVar264 = ZEXT864(0) << 0x20;
        auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar273 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar280._8_4_ = 0x7f800000;
        auVar280._0_8_ = 0x7f8000007f800000;
        auVar280._12_4_ = 0x7f800000;
        auVar280._16_4_ = 0x7f800000;
        auVar280._20_4_ = 0x7f800000;
        auVar280._24_4_ = 0x7f800000;
        auVar280._28_4_ = 0x7f800000;
        auVar286._8_4_ = 0xff800000;
        auVar286._0_8_ = 0xff800000ff800000;
        auVar286._12_4_ = 0xff800000;
        auVar286._16_4_ = 0xff800000;
        auVar286._20_4_ = 0xff800000;
        auVar286._24_4_ = 0xff800000;
        auVar286._28_4_ = 0xff800000;
      }
      else {
        auVar123 = vrcpps_avx(local_960);
        auVar124._8_4_ = 0x3f800000;
        auVar124._0_8_ = 0x3f8000003f800000;
        auVar124._12_4_ = 0x3f800000;
        auVar124._16_4_ = 0x3f800000;
        auVar124._20_4_ = 0x3f800000;
        auVar124._24_4_ = 0x3f800000;
        auVar124._28_4_ = 0x3f800000;
        auVar111 = vfnmadd213ps_fma(local_960,auVar123,auVar124);
        auVar180 = vsqrtps_avx(auVar15);
        auVar111 = vfmadd132ps_fma(ZEXT1632(auVar111),auVar123,auVar123);
        uVar98 = CONCAT44(local_320._4_4_,local_320._0_4_);
        auVar229._0_8_ = uVar98 ^ 0x8000000080000000;
        auVar229._8_4_ = -local_320._8_4_;
        auVar229._12_4_ = -local_320._12_4_;
        auVar229._16_4_ = -local_320._16_4_;
        auVar229._20_4_ = -local_320._20_4_;
        auVar229._24_4_ = -local_320._24_4_;
        auVar229._28_4_ = -local_320._28_4_;
        auVar123 = vsubps_avx(auVar229,auVar180);
        auVar180 = vsubps_avx(auVar180,local_320);
        fVar189 = auVar123._0_4_ * auVar111._0_4_;
        fVar218 = auVar123._4_4_ * auVar111._4_4_;
        auVar58._4_4_ = fVar218;
        auVar58._0_4_ = fVar189;
        fVar238 = auVar123._8_4_ * auVar111._8_4_;
        auVar58._8_4_ = fVar238;
        fVar239 = auVar123._12_4_ * auVar111._12_4_;
        auVar58._12_4_ = fVar239;
        fVar240 = auVar123._16_4_ * 0.0;
        auVar58._16_4_ = fVar240;
        fVar241 = auVar123._20_4_ * 0.0;
        auVar58._20_4_ = fVar241;
        fVar242 = auVar123._24_4_ * 0.0;
        auVar58._24_4_ = fVar242;
        auVar58._28_4_ = auVar123._28_4_;
        fVar248 = auVar180._0_4_ * auVar111._0_4_;
        fVar249 = auVar180._4_4_ * auVar111._4_4_;
        auVar59._4_4_ = fVar249;
        auVar59._0_4_ = fVar248;
        fVar250 = auVar180._8_4_ * auVar111._8_4_;
        auVar59._8_4_ = fVar250;
        fVar104 = auVar180._12_4_ * auVar111._12_4_;
        auVar59._12_4_ = fVar104;
        fVar134 = auVar180._16_4_ * 0.0;
        auVar59._16_4_ = fVar134;
        fVar135 = auVar180._20_4_ * 0.0;
        auVar59._20_4_ = fVar135;
        fVar136 = auVar180._24_4_ * 0.0;
        auVar59._24_4_ = fVar136;
        auVar59._28_4_ = uVar140;
        auVar111 = vfmadd213ps_fma(auVar258,auVar58,auVar233);
        auVar5 = vfmadd213ps_fma(auVar258,auVar59,auVar233);
        auVar233 = ZEXT1632(CONCAT412(fVar251 * auVar111._12_4_,
                                      CONCAT48(fVar219 * auVar111._8_4_,
                                               CONCAT44(fVar217 * auVar111._4_4_,
                                                        fVar204 * auVar111._0_4_))));
        auVar60._28_4_ = auVar13._28_4_;
        auVar60._0_28_ =
             ZEXT1628(CONCAT412(auVar5._12_4_ * fVar251,
                                CONCAT48(auVar5._8_4_ * fVar219,
                                         CONCAT44(auVar5._4_4_ * fVar217,auVar5._0_4_ * fVar204))));
        auVar111 = vfmadd213ps_fma(local_2e0,auVar233,auVar116);
        auVar5 = vfmadd213ps_fma(local_2e0,auVar60,auVar116);
        auVar291 = vfmadd213ps_fma(local_300,auVar233,local_2a0);
        auVar107 = vfmadd213ps_fma(local_300,auVar60,local_2a0);
        auVar221 = vfmadd213ps_fma(auVar233,local_2c0,auVar149);
        auVar169 = vfmadd213ps_fma(local_2c0,auVar60,auVar149);
        auVar61._4_4_ = (float)local_700._4_4_ * fVar218;
        auVar61._0_4_ = (float)local_700._0_4_ * fVar189;
        auVar61._8_4_ = fStack_6f8 * fVar238;
        auVar61._12_4_ = fStack_6f4 * fVar239;
        auVar61._16_4_ = fStack_6f0 * fVar240;
        auVar61._20_4_ = fStack_6ec * fVar241;
        auVar61._24_4_ = fStack_6e8 * fVar242;
        auVar61._28_4_ = 0;
        auVar123 = vsubps_avx(auVar61,ZEXT1632(auVar111));
        auVar150._0_4_ = (float)local_720._0_4_ * fVar189;
        auVar150._4_4_ = (float)local_720._4_4_ * fVar218;
        auVar150._8_4_ = fStack_718 * fVar238;
        auVar150._12_4_ = fStack_714 * fVar239;
        auVar150._16_4_ = fStack_710 * fVar240;
        auVar150._20_4_ = fStack_70c * fVar241;
        auVar150._24_4_ = fStack_708 * fVar242;
        auVar150._28_4_ = 0;
        auVar119 = vsubps_avx(auVar150,ZEXT1632(auVar291));
        auVar181._0_4_ = (float)local_740._0_4_ * fVar189;
        auVar181._4_4_ = (float)local_740._4_4_ * fVar218;
        auVar181._8_4_ = fStack_738 * fVar238;
        auVar181._12_4_ = fStack_734 * fVar239;
        auVar181._16_4_ = fStack_730 * fVar240;
        auVar181._20_4_ = fStack_72c * fVar241;
        auVar181._24_4_ = fStack_728 * fVar242;
        auVar181._28_4_ = 0;
        auVar246 = vsubps_avx(auVar181,ZEXT1632(auVar221));
        auVar234._0_4_ = fVar248 * (float)local_700._0_4_;
        auVar234._4_4_ = fVar249 * (float)local_700._4_4_;
        auVar234._8_4_ = fVar250 * fStack_6f8;
        auVar234._12_4_ = fVar104 * fStack_6f4;
        auVar234._16_4_ = fVar134 * fStack_6f0;
        auVar234._20_4_ = fVar135 * fStack_6ec;
        auVar234._24_4_ = fVar136 * fStack_6e8;
        auVar234._28_4_ = 0;
        auVar180 = vsubps_avx(auVar234,ZEXT1632(auVar5));
        auVar62._4_4_ = (float)local_720._4_4_ * fVar249;
        auVar62._0_4_ = (float)local_720._0_4_ * fVar248;
        auVar62._8_4_ = fStack_718 * fVar250;
        auVar62._12_4_ = fStack_714 * fVar104;
        auVar62._16_4_ = fStack_710 * fVar134;
        auVar62._20_4_ = fStack_70c * fVar135;
        auVar62._24_4_ = fStack_708 * fVar136;
        auVar62._28_4_ = uStack_6e4;
        auVar13 = vsubps_avx(auVar62,ZEXT1632(auVar107));
        auVar247 = ZEXT3264(auVar13);
        auVar63._4_4_ = (float)local_740._4_4_ * fVar249;
        auVar63._0_4_ = (float)local_740._0_4_ * fVar248;
        auVar63._8_4_ = fStack_738 * fVar250;
        auVar63._12_4_ = fStack_734 * fVar104;
        auVar63._16_4_ = fStack_730 * fVar134;
        auVar63._20_4_ = fStack_72c * fVar135;
        auVar63._24_4_ = fStack_728 * fVar136;
        auVar63._28_4_ = uVar99;
        auVar13 = vsubps_avx(auVar63,ZEXT1632(auVar169));
        auVar264 = ZEXT3264(auVar13);
        auVar13 = vcmpps_avx(auVar15,_DAT_01f7b000,5);
        auVar281._8_4_ = 0x7f800000;
        auVar281._0_8_ = 0x7f8000007f800000;
        auVar281._12_4_ = 0x7f800000;
        auVar281._16_4_ = 0x7f800000;
        auVar281._20_4_ = 0x7f800000;
        auVar281._24_4_ = 0x7f800000;
        auVar281._28_4_ = 0x7f800000;
        auVar280 = vblendvps_avx(auVar281,auVar58,auVar13);
        auVar233 = vmaxps_avx(local_640,_local_a20);
        auVar64._4_4_ = auVar233._4_4_ * 1.9073486e-06;
        auVar64._0_4_ = auVar233._0_4_ * 1.9073486e-06;
        auVar64._8_4_ = auVar233._8_4_ * 1.9073486e-06;
        auVar64._12_4_ = auVar233._12_4_ * 1.9073486e-06;
        auVar64._16_4_ = auVar233._16_4_ * 1.9073486e-06;
        auVar64._20_4_ = auVar233._20_4_ * 1.9073486e-06;
        auVar64._24_4_ = auVar233._24_4_ * 1.9073486e-06;
        auVar64._28_4_ = auVar233._28_4_;
        auVar233 = vcmpps_avx(local_400,auVar64,1);
        auVar287._8_4_ = 0xff800000;
        auVar287._0_8_ = 0xff800000ff800000;
        auVar287._12_4_ = 0xff800000;
        auVar287._16_4_ = 0xff800000;
        auVar287._20_4_ = 0xff800000;
        auVar287._24_4_ = 0xff800000;
        auVar287._28_4_ = 0xff800000;
        auVar286 = vblendvps_avx(auVar287,auVar59,auVar13);
        auVar15 = auVar13 & auVar233;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar12 = vandps_avx(auVar13,auVar233);
          auVar233 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,2);
          auVar274._8_4_ = 0xff800000;
          auVar274._0_8_ = 0xff800000ff800000;
          auVar274._12_4_ = 0xff800000;
          auVar274._16_4_ = 0xff800000;
          auVar274._20_4_ = 0xff800000;
          auVar274._24_4_ = 0xff800000;
          auVar274._28_4_ = 0xff800000;
          auVar293._8_4_ = 0x7f800000;
          auVar293._0_8_ = 0x7f8000007f800000;
          auVar293._12_4_ = 0x7f800000;
          auVar293._16_4_ = 0x7f800000;
          auVar293._20_4_ = 0x7f800000;
          auVar293._24_4_ = 0x7f800000;
          auVar293._28_4_ = 0x7f800000;
          auVar118 = vblendvps_avx(auVar293,auVar274,auVar233);
          auVar111 = vpackssdw_avx(auVar12._0_16_,auVar12._16_16_);
          auVar15 = vpmovsxwd_avx2(auVar111);
          auVar280 = vblendvps_avx(auVar280,auVar118,auVar15);
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar118 = vblendvps_avx(auVar274,auVar237,auVar233);
          auVar286 = vblendvps_avx(auVar286,auVar118,auVar15);
          auVar230._0_8_ = auVar12._0_8_ ^ 0xffffffffffffffff;
          auVar230._8_4_ = auVar12._8_4_ ^ 0xffffffff;
          auVar230._12_4_ = auVar12._12_4_ ^ 0xffffffff;
          auVar230._16_4_ = auVar12._16_4_ ^ 0xffffffff;
          auVar230._20_4_ = auVar12._20_4_ ^ 0xffffffff;
          auVar230._24_4_ = auVar12._24_4_ ^ 0xffffffff;
          auVar230._28_4_ = auVar12._28_4_ ^ 0xffffffff;
          auVar12 = vorps_avx(auVar233,auVar230);
          auVar12 = vandps_avx(auVar13,auVar12);
        }
        auVar273 = auVar246._0_28_;
      }
      local_4a0 = auVar14;
      local_480 = vminps_avx(local_440,auVar280);
      auVar118 = vmaxps_avx(auVar14,auVar286);
      auVar288 = ZEXT3264(auVar118);
      _local_460 = auVar118;
      auVar13 = vcmpps_avx(auVar14,local_480,2);
      local_680 = vandps_avx(auVar13,auVar126);
      auVar13 = vcmpps_avx(auVar118,local_440,2);
      _local_a00 = vandps_avx(auVar13,auVar126);
      auVar126 = vorps_avx(_local_a00,local_680);
      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0x7f,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0xbf,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar126[0x1f]) goto LAB_0138942e;
      auVar282 = ZEXT3264(_local_740);
      auVar65._4_4_ = (float)local_740._4_4_ * auVar264._4_4_;
      auVar65._0_4_ = (float)local_740._0_4_ * auVar264._0_4_;
      auVar65._8_4_ = fStack_738 * auVar264._8_4_;
      auVar65._12_4_ = fStack_734 * auVar264._12_4_;
      auVar65._16_4_ = fStack_730 * auVar264._16_4_;
      auVar65._20_4_ = fStack_72c * auVar264._20_4_;
      auVar65._24_4_ = fStack_728 * auVar264._24_4_;
      auVar65._28_4_ = auVar126._28_4_;
      auVar111 = vfmadd213ps_fma(auVar247._0_32_,_local_720,auVar65);
      auVar111 = vfmadd213ps_fma(auVar180,_local_700,ZEXT1632(auVar111));
      auVar247 = ZEXT3264(_local_720);
      auVar202._0_8_ = auVar12._0_8_ ^ 0xffffffffffffffff;
      auVar202._8_4_ = auVar12._8_4_ ^ 0xffffffff;
      auVar202._12_4_ = auVar12._12_4_ ^ 0xffffffff;
      auVar202._16_4_ = auVar12._16_4_ ^ 0xffffffff;
      auVar202._20_4_ = auVar12._20_4_ ^ 0xffffffff;
      auVar202._24_4_ = auVar12._24_4_ ^ 0xffffffff;
      auVar202._28_4_ = auVar12._28_4_ ^ 0xffffffff;
      auVar264 = ZEXT3264(local_680);
      auVar126 = vandps_avx(ZEXT1632(auVar111),local_9e0);
      auVar235._8_4_ = 0x3e99999a;
      auVar235._0_8_ = 0x3e99999a3e99999a;
      auVar235._12_4_ = 0x3e99999a;
      auVar235._16_4_ = 0x3e99999a;
      auVar235._20_4_ = 0x3e99999a;
      auVar235._24_4_ = 0x3e99999a;
      auVar235._28_4_ = 0x3e99999a;
      auVar126 = vcmpps_avx(auVar126,auVar235,1);
      local_6c0 = vorps_avx(auVar126,auVar202);
      auVar183._0_4_ = (float)local_740._0_4_ * auVar273._0_4_;
      auVar183._4_4_ = (float)local_740._4_4_ * auVar273._4_4_;
      auVar183._8_4_ = fStack_738 * auVar273._8_4_;
      auVar183._12_4_ = fStack_734 * auVar273._12_4_;
      auVar183._16_4_ = fStack_730 * auVar273._16_4_;
      auVar183._20_4_ = fStack_72c * auVar273._20_4_;
      auVar183._24_4_ = fStack_728 * auVar273._24_4_;
      auVar183._28_4_ = 0;
      auVar111 = vfmadd213ps_fma(auVar119,_local_720,auVar183);
      auVar111 = vfmadd213ps_fma(auVar123,_local_700,ZEXT1632(auVar111));
      auVar126 = vandps_avx(ZEXT1632(auVar111),local_9e0);
      auVar126 = vcmpps_avx(auVar126,auVar235,1);
      auVar126 = vorps_avx(auVar126,auVar202);
      auVar152._8_4_ = 3;
      auVar152._0_8_ = 0x300000003;
      auVar152._12_4_ = 3;
      auVar152._16_4_ = 3;
      auVar152._20_4_ = 3;
      auVar152._24_4_ = 3;
      auVar152._28_4_ = 3;
      auVar184._8_4_ = 2;
      auVar184._0_8_ = 0x200000002;
      auVar184._12_4_ = 2;
      auVar184._16_4_ = 2;
      auVar184._20_4_ = 2;
      auVar184._24_4_ = 2;
      auVar184._28_4_ = 2;
      auVar126 = vblendvps_avx(auVar184,auVar152,auVar126);
      local_6e0._4_4_ = local_c24;
      local_6e0._0_4_ = local_c24;
      local_6e0._8_4_ = local_c24;
      local_6e0._12_4_ = local_c24;
      local_6e0._16_4_ = local_c24;
      local_6e0._20_4_ = local_c24;
      local_6e0._24_4_ = local_c24;
      local_6e0._28_4_ = local_c24;
      local_6a0 = vpcmpgtd_avx2(auVar126,local_6e0);
      local_4c0 = vpandn_avx2(local_6a0,local_680);
      local_8e0._4_4_ = auVar14._4_4_ + fVar133;
      local_8e0._0_4_ = auVar14._0_4_ + fVar133;
      fStack_8d8 = auVar14._8_4_ + fVar133;
      fStack_8d4 = auVar14._12_4_ + fVar133;
      fStack_8d0 = auVar14._16_4_ + fVar133;
      fStack_8cc = auVar14._20_4_ + fVar133;
      fStack_8c8 = auVar14._24_4_ + fVar133;
      fStack_8c4 = auVar14._28_4_ + fVar133;
      auVar275 = ZEXT3264(_local_a00);
      while( true ) {
        auVar126 = _local_460;
        auVar288 = ZEXT3264(auVar118);
        fStack_afc = auVar2._4_4_;
        fStack_af8 = auVar2._8_4_;
        fStack_af4 = auVar2._12_4_;
        if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_4c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_4c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_4c0 >> 0x7f,0) == '\0') &&
              (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_4c0 >> 0xbf,0) == '\0') &&
            (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_4c0[0x1f]) break;
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar153._16_4_ = 0x7f800000;
        auVar153._20_4_ = 0x7f800000;
        auVar153._24_4_ = 0x7f800000;
        auVar153._28_4_ = 0x7f800000;
        auVar126 = vblendvps_avx(auVar153,auVar14,local_4c0);
        auVar12 = vshufps_avx(auVar126,auVar126,0xb1);
        auVar12 = vminps_avx(auVar126,auVar12);
        auVar13 = vshufpd_avx(auVar12,auVar12,5);
        auVar12 = vminps_avx(auVar12,auVar13);
        auVar13 = vpermpd_avx2(auVar12,0x4e);
        auVar12 = vminps_avx(auVar12,auVar13);
        auVar12 = vcmpps_avx(auVar126,auVar12,0);
        auVar13 = local_4c0 & auVar12;
        auVar126 = local_4c0;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar126 = vandps_avx(auVar12,local_4c0);
        }
        uVar92 = vmovmskps_avx(auVar126);
        iVar16 = 0;
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          iVar16 = iVar16 + 1;
        }
        uVar98 = (ulong)(uint)(iVar16 << 2);
        *(undefined4 *)(local_4c0 + uVar98) = 0;
        uVar92 = *(uint *)(local_1a0 + uVar98);
        uVar96 = *(uint *)(local_4a0 + uVar98);
        fVar189 = auVar10._0_4_;
        if ((float)local_980._0_4_ < 0.0) {
          auVar247 = ZEXT1664(auVar247._0_16_);
          auVar282 = ZEXT1664(auVar282._0_16_);
          fVar189 = sqrtf((float)local_980._0_4_);
          uVar98 = extraout_RAX;
        }
        auVar5 = vminps_avx(auVar3,auVar4);
        auVar111 = vmaxps_avx(auVar3,auVar4);
        auVar291 = vminps_avx(auVar1,auVar2);
        auVar107 = vminps_avx(auVar5,auVar291);
        auVar5 = vmaxps_avx(auVar1,auVar2);
        auVar291 = vmaxps_avx(auVar111,auVar5);
        local_840._8_4_ = NAN;
        local_840._0_8_ = 0x7fffffff7fffffff;
        local_840._12_4_ = NAN;
        auVar111 = vandps_avx(auVar107,local_840._0_16_);
        auVar5 = vandps_avx(auVar291,local_840._0_16_);
        auVar111 = vmaxps_avx(auVar111,auVar5);
        auVar5 = vmovshdup_avx(auVar111);
        auVar5 = vmaxss_avx(auVar5,auVar111);
        auVar111 = vshufpd_avx(auVar111,auVar111,1);
        auVar111 = vmaxss_avx(auVar111,auVar5);
        fVar204 = auVar111._0_4_ * 1.9073486e-06;
        local_860._0_4_ = fVar189 * 1.9073486e-06;
        local_8c0._0_16_ = vshufps_avx(auVar291,auVar291,0xff);
        auVar111 = vinsertps_avx(ZEXT416(uVar96),ZEXT416(uVar92),0x10);
        auVar264 = ZEXT1664(auVar111);
        uVar100 = 0;
        while( true ) {
          auVar111 = auVar264._0_16_;
          bVar102 = (byte)uVar98;
          if (uVar100 == 5) break;
          auVar291 = vmovshdup_avx(auVar111);
          fVar251 = auVar291._0_4_;
          fVar238 = 1.0 - fVar251;
          fVar219 = fVar238 * fVar238 * fVar238;
          fVar218 = fVar251 * fVar251 * fVar251;
          auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                     ZEXT416((uint)fVar218));
          fVar189 = fVar251 * fVar238;
          auVar221 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar189 * 6.0)),
                                     ZEXT416((uint)(fVar238 * fVar189)),
                                     SUB6416(ZEXT464(0x41400000),0));
          auVar169 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * fVar189 * 6.0)),
                                     SUB6416(ZEXT464(0x41400000),0),
                                     ZEXT416((uint)(fVar251 * fVar189)));
          auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                   ZEXT416((uint)fVar219));
          fVar217 = (auVar5._0_4_ + auVar169._0_4_) * 0.16666667;
          fVar218 = fVar218 * 0.16666667;
          auVar141._0_4_ = fVar218 * fVar188;
          auVar141._4_4_ = fVar218 * fStack_afc;
          auVar141._8_4_ = fVar218 * fStack_af8;
          auVar141._12_4_ = fVar218 * fStack_af4;
          auVar190._4_4_ = fVar217;
          auVar190._0_4_ = fVar217;
          auVar190._8_4_ = fVar217;
          auVar190._12_4_ = fVar217;
          auVar5 = vfmadd132ps_fma(auVar190,auVar141,auVar1);
          fVar217 = (auVar107._0_4_ + auVar221._0_4_) * 0.16666667;
          auVar142._4_4_ = fVar217;
          auVar142._0_4_ = fVar217;
          auVar142._8_4_ = fVar217;
          auVar142._12_4_ = fVar217;
          auVar5 = vfmadd132ps_fma(auVar142,auVar5,auVar4);
          fVar218 = auVar264._0_4_;
          auVar159._4_4_ = fVar218;
          auVar159._0_4_ = fVar218;
          auVar159._8_4_ = fVar218;
          auVar159._12_4_ = fVar218;
          auVar107 = vfmadd213ps_fma(auVar159,local_970,_DAT_01f45a50);
          fVar219 = fVar219 * 0.16666667;
          auVar106._4_4_ = fVar219;
          auVar106._0_4_ = fVar219;
          auVar106._8_4_ = fVar219;
          auVar106._12_4_ = fVar219;
          auVar5 = vfmadd132ps_fma(auVar106,auVar5,auVar3);
          local_820._0_16_ = auVar5;
          auVar5 = vsubps_avx(auVar107,auVar5);
          _local_a20 = auVar5;
          auVar5 = vdpps_avx(auVar5,auVar5,0x7f);
          fVar217 = auVar5._0_4_;
          if (fVar217 < 0.0) {
            auVar282._0_4_ = sqrtf(fVar217);
            auVar282._4_60_ = extraout_var;
            auVar107 = auVar282._0_16_;
            uVar98 = extraout_RAX_00;
          }
          else {
            auVar107 = vsqrtss_avx(auVar5,auVar5);
          }
          auVar278 = ZEXT416((uint)fVar238);
          auVar108._4_4_ = fVar238;
          auVar108._0_4_ = fVar238;
          auVar108._8_4_ = fVar238;
          auVar108._12_4_ = fVar238;
          auVar169 = vfnmsub213ss_fma(auVar291,auVar291,ZEXT416((uint)(fVar189 * 4.0)));
          auVar221 = vfmadd231ss_fma(ZEXT416((uint)(fVar189 * 4.0)),auVar278,auVar278);
          fVar189 = fVar238 * -fVar238 * 0.5;
          fVar219 = auVar169._0_4_ * 0.5;
          fVar238 = auVar221._0_4_ * 0.5;
          fVar251 = fVar251 * fVar251 * 0.5;
          auVar222._0_4_ = fVar188 * fVar251;
          auVar222._4_4_ = fStack_afc * fVar251;
          auVar222._8_4_ = fStack_af8 * fVar251;
          auVar222._12_4_ = fStack_af4 * fVar251;
          auVar191._4_4_ = fVar238;
          auVar191._0_4_ = fVar238;
          auVar191._8_4_ = fVar238;
          auVar191._12_4_ = fVar238;
          auVar221 = vfmadd213ps_fma(auVar191,auVar1,auVar222);
          auVar205._4_4_ = fVar219;
          auVar205._0_4_ = fVar219;
          auVar205._8_4_ = fVar219;
          auVar205._12_4_ = fVar219;
          auVar221 = vfmadd213ps_fma(auVar205,auVar4,auVar221);
          auVar271._4_4_ = fVar189;
          auVar271._0_4_ = fVar189;
          auVar271._8_4_ = fVar189;
          auVar271._12_4_ = fVar189;
          auVar231 = vfmadd213ps_fma(auVar271,auVar3,auVar221);
          auVar221 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar278,auVar291);
          auVar169 = vfmadd213ss_fma(auVar291,SUB6416(ZEXT464(0xc0000000),0),auVar278);
          auVar291 = vshufps_avx(auVar111,auVar111,0x55);
          auVar192._0_4_ = fVar188 * auVar291._0_4_;
          auVar192._4_4_ = fStack_afc * auVar291._4_4_;
          auVar192._8_4_ = fStack_af8 * auVar291._8_4_;
          auVar192._12_4_ = fStack_af4 * auVar291._12_4_;
          uVar99 = auVar169._0_4_;
          auVar206._4_4_ = uVar99;
          auVar206._0_4_ = uVar99;
          auVar206._8_4_ = uVar99;
          auVar206._12_4_ = uVar99;
          auVar291 = vfmadd213ps_fma(auVar206,auVar1,auVar192);
          auVar160._0_4_ = auVar221._0_4_;
          auVar160._4_4_ = auVar160._0_4_;
          auVar160._8_4_ = auVar160._0_4_;
          auVar160._12_4_ = auVar160._0_4_;
          auVar291 = vfmadd213ps_fma(auVar160,auVar4,auVar291);
          auVar278 = vfmadd231ps_fma(auVar291,auVar3,auVar108);
          auVar221 = vdpps_avx(auVar231,auVar231,0x7f);
          auVar291 = vblendps_avx(auVar221,_DAT_01f45a50,0xe);
          auVar169 = vrsqrtss_avx(auVar291,auVar291);
          fVar189 = auVar169._0_4_;
          fVar238 = auVar221._0_4_;
          fVar189 = fVar189 * 1.5 + fVar238 * -0.5 * fVar189 * fVar189 * fVar189;
          auVar169 = vdpps_avx(auVar231,auVar278,0x7f);
          auVar161._0_4_ = auVar278._0_4_ * fVar238;
          auVar161._4_4_ = auVar278._4_4_ * fVar238;
          auVar161._8_4_ = auVar278._8_4_ * fVar238;
          auVar161._12_4_ = auVar278._12_4_ * fVar238;
          fVar219 = auVar169._0_4_;
          auVar223._0_4_ = auVar231._0_4_ * fVar219;
          auVar223._4_4_ = auVar231._4_4_ * fVar219;
          fVar251 = auVar231._8_4_;
          auVar223._8_4_ = fVar251 * fVar219;
          fVar239 = auVar231._12_4_;
          auVar223._12_4_ = fVar239 * fVar219;
          auVar169 = vsubps_avx(auVar161,auVar223);
          auVar291 = vrcpss_avx(auVar291,auVar291);
          auVar278 = vfnmadd213ss_fma(auVar291,auVar221,ZEXT416(0x40000000));
          fVar219 = auVar291._0_4_ * auVar278._0_4_;
          auVar291 = vmaxss_avx(ZEXT416((uint)fVar204),
                                ZEXT416((uint)(fVar218 * (float)local_860._0_4_)));
          auVar275 = ZEXT1664(auVar291);
          auVar243._0_8_ = auVar231._0_8_ ^ 0x8000000080000000;
          auVar243._8_4_ = -fVar251;
          auVar243._12_4_ = -fVar239;
          auVar193._0_4_ = fVar189 * auVar169._0_4_ * fVar219;
          auVar193._4_4_ = fVar189 * auVar169._4_4_ * fVar219;
          auVar193._8_4_ = fVar189 * auVar169._8_4_ * fVar219;
          auVar193._12_4_ = fVar189 * auVar169._12_4_ * fVar219;
          auVar252._0_4_ = auVar231._0_4_ * fVar189;
          auVar252._4_4_ = auVar231._4_4_ * fVar189;
          auVar252._8_4_ = fVar251 * fVar189;
          auVar252._12_4_ = fVar239 * fVar189;
          if (fVar238 < -fVar238) {
            local_9a0._0_16_ = auVar252;
            local_9c0._0_16_ = auVar193;
            fVar189 = sqrtf(fVar238);
            auVar275 = ZEXT464(auVar291._0_4_);
            auVar107 = ZEXT416(auVar107._0_4_);
            uVar98 = extraout_RAX_01;
            auVar193 = local_9c0._0_16_;
            auVar252 = local_9a0._0_16_;
          }
          else {
            auVar221 = vsqrtss_avx(auVar221,auVar221);
            fVar189 = auVar221._0_4_;
          }
          auVar221 = vdpps_avx(_local_a20,auVar252,0x7f);
          auVar285 = vfmadd213ss_fma(ZEXT416((uint)fVar204),auVar107,auVar275._0_16_);
          auVar169 = vdpps_avx(auVar243,auVar252,0x7f);
          auVar278 = vdpps_avx(_local_a20,auVar193,0x7f);
          auVar283 = vdpps_avx(local_970,auVar252,0x7f);
          auVar285 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                     ZEXT416((uint)(fVar204 / fVar189)),auVar285);
          fVar189 = auVar169._0_4_ + auVar278._0_4_;
          fVar219 = auVar221._0_4_;
          auVar109._0_4_ = fVar219 * fVar219;
          auVar109._4_4_ = auVar221._4_4_ * auVar221._4_4_;
          auVar109._8_4_ = auVar221._8_4_ * auVar221._8_4_;
          auVar109._12_4_ = auVar221._12_4_ * auVar221._12_4_;
          auVar107 = vdpps_avx(_local_a20,auVar243,0x7f);
          auVar247 = ZEXT1664(auVar107);
          auVar278 = vsubps_avx(auVar5,auVar109);
          auVar169 = vrsqrtss_avx(auVar278,auVar278);
          fVar238 = auVar278._0_4_;
          fVar218 = auVar169._0_4_;
          fVar218 = fVar218 * 1.5 + fVar238 * -0.5 * fVar218 * fVar218 * fVar218;
          auVar169 = vdpps_avx(_local_a20,local_970,0x7f);
          auVar112 = vfnmadd231ss_fma(auVar107,auVar221,ZEXT416((uint)fVar189));
          auVar169 = vfnmadd231ss_fma(auVar169,auVar221,auVar283);
          if (fVar238 < 0.0) {
            local_9a0._0_16_ = ZEXT416((uint)fVar189);
            local_9c0._0_16_ = auVar283;
            local_960._0_16_ = auVar112;
            local_880._0_4_ = fVar218;
            local_8a0._0_16_ = auVar169;
            auVar247 = ZEXT1664(auVar107);
            fVar238 = sqrtf(fVar238);
            auVar275 = ZEXT464(auVar291._0_4_);
            uVar98 = extraout_RAX_02;
            fVar218 = (float)local_880._0_4_;
            auVar169 = local_8a0._0_16_;
            auVar112 = local_960._0_16_;
            auVar283 = local_9c0._0_16_;
            auVar291 = local_9a0._0_16_;
          }
          else {
            auVar291 = vsqrtss_avx(auVar278,auVar278);
            fVar238 = auVar291._0_4_;
            auVar291 = ZEXT416((uint)fVar189);
          }
          auVar282 = ZEXT1664(auVar231);
          auVar107 = vpermilps_avx(local_820._0_16_,0xff);
          fVar238 = fVar238 - auVar107._0_4_;
          auVar278 = vshufps_avx(auVar231,auVar231,0xff);
          auVar107 = vfmsub213ss_fma(auVar112,ZEXT416((uint)fVar218),auVar278);
          auVar194._0_8_ = auVar283._0_8_ ^ 0x8000000080000000;
          auVar194._8_4_ = auVar283._8_4_ ^ 0x80000000;
          auVar194._12_4_ = auVar283._12_4_ ^ 0x80000000;
          auVar207._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
          auVar207._8_4_ = auVar107._8_4_ ^ 0x80000000;
          auVar207._12_4_ = auVar107._12_4_ ^ 0x80000000;
          auVar112 = ZEXT416((uint)(auVar169._0_4_ * fVar218));
          auVar169 = vfmsub231ss_fma(ZEXT416((uint)(auVar283._0_4_ * auVar107._0_4_)),auVar291,
                                     auVar112);
          auVar107 = vinsertps_avx(auVar207,auVar112,0x1c);
          uVar99 = auVar169._0_4_;
          auVar208._4_4_ = uVar99;
          auVar208._0_4_ = uVar99;
          auVar208._8_4_ = uVar99;
          auVar208._12_4_ = uVar99;
          auVar107 = vdivps_avx(auVar107,auVar208);
          auVar291 = vinsertps_avx(auVar291,auVar194,0x10);
          auVar291 = vdivps_avx(auVar291,auVar208);
          auVar162._0_4_ = fVar219 * auVar107._0_4_ + fVar238 * auVar291._0_4_;
          auVar162._4_4_ = fVar219 * auVar107._4_4_ + fVar238 * auVar291._4_4_;
          auVar162._8_4_ = fVar219 * auVar107._8_4_ + fVar238 * auVar291._8_4_;
          auVar162._12_4_ = fVar219 * auVar107._12_4_ + fVar238 * auVar291._12_4_;
          auVar291 = vsubps_avx(auVar111,auVar162);
          auVar264 = ZEXT1664(auVar291);
          auVar111 = vandps_avx(auVar221,local_840._0_16_);
          if (auVar111._0_4_ < auVar285._0_4_) {
            auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar285._0_4_ + auVar275._0_4_)),
                                       local_8c0._0_16_,ZEXT416(0x36000000));
            auVar111 = vandps_avx(ZEXT416((uint)fVar238),local_840._0_16_);
            if (auVar111._0_4_ < auVar107._0_4_) {
              bVar101 = uVar100 < 5;
              fVar189 = auVar291._0_4_ + (float)local_940._0_4_;
              if (fVar189 < fVar103) {
                bVar102 = 0;
                goto LAB_01389ce7;
              }
              fVar204 = *(float *)(ray + k * 4 + 0x80);
              auVar275 = ZEXT3264(_local_a00);
              if (fVar189 <= fVar204) {
                auVar111 = vmovshdup_avx(auVar291);
                bVar102 = 0;
                if ((auVar111._0_4_ < 0.0) || (1.0 < auVar111._0_4_)) goto LAB_01389d0b;
                auVar111 = vrsqrtss_avx(auVar5,auVar5);
                fVar218 = auVar111._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar93].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar102 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar217 = fVar218 * 1.5 + fVar217 * -0.5 * fVar218 * fVar218 * fVar218;
                    auVar163._0_4_ = fVar217 * (float)local_a20._0_4_;
                    auVar163._4_4_ = fVar217 * (float)local_a20._4_4_;
                    auVar163._8_4_ = fVar217 * fStack_a18;
                    auVar163._12_4_ = fVar217 * fStack_a14;
                    auVar221 = vfmadd213ps_fma(auVar278,auVar163,auVar231);
                    auVar111 = vshufps_avx(auVar163,auVar163,0xc9);
                    auVar5 = vshufps_avx(auVar231,auVar231,0xc9);
                    auVar164._0_4_ = auVar163._0_4_ * auVar5._0_4_;
                    auVar164._4_4_ = auVar163._4_4_ * auVar5._4_4_;
                    auVar164._8_4_ = auVar163._8_4_ * auVar5._8_4_;
                    auVar164._12_4_ = auVar163._12_4_ * auVar5._12_4_;
                    auVar107 = vfmsub231ps_fma(auVar164,auVar231,auVar111);
                    auVar111 = vshufps_avx(auVar107,auVar107,0xc9);
                    auVar5 = vshufps_avx(auVar221,auVar221,0xc9);
                    auVar107 = vshufps_avx(auVar107,auVar107,0xd2);
                    auVar110._0_4_ = auVar221._0_4_ * auVar107._0_4_;
                    auVar110._4_4_ = auVar221._4_4_ * auVar107._4_4_;
                    auVar110._8_4_ = auVar221._8_4_ * auVar107._8_4_;
                    auVar110._12_4_ = auVar221._12_4_ * auVar107._12_4_;
                    auVar111 = vfmsub231ps_fma(auVar110,auVar111,auVar5);
                    local_7b0 = vshufps_avx(auVar291,auVar291,0x55);
                    local_7e0 = (RTCHitN  [16])vshufps_avx(auVar111,auVar111,0x55);
                    auStack_7d0 = vshufps_avx(auVar111,auVar111,0xaa);
                    local_7c0 = auVar111._0_4_;
                    local_7a0 = ZEXT416(0) << 0x20;
                    local_790 = CONCAT44(uStack_7fc,local_800);
                    uStack_788 = CONCAT44(uStack_7f4,uStack_7f8);
                    local_780._4_4_ = uStack_7ec;
                    local_780._0_4_ = local_7f0;
                    local_780._8_4_ = uStack_7e8;
                    local_780._12_4_ = uStack_7e4;
                    vpcmpeqd_avx2(ZEXT1632(local_780),ZEXT1632(local_780));
                    uStack_76c = context->user->instID[0];
                    local_770 = uStack_76c;
                    uStack_768 = uStack_76c;
                    uStack_764 = uStack_76c;
                    uStack_760 = context->user->instPrimID[0];
                    uStack_75c = uStack_760;
                    uStack_758 = uStack_760;
                    uStack_754 = uStack_760;
                    *(float *)(ray + k * 4 + 0x80) = fVar189;
                    auVar111 = *(undefined1 (*) [16])
                                (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                    local_900._0_16_ = auVar111;
                    local_a50.valid = (int *)local_900;
                    local_a50.geometryUserPtr = pGVar7->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_7e0;
                    local_a50.N = 4;
                    local_a50.ray = (RTCRayN *)ray;
                    uStack_7bc = local_7c0;
                    uStack_7b8 = local_7c0;
                    uStack_7b4 = local_7c0;
                    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar264 = ZEXT1664(auVar291);
                      auVar282 = ZEXT1664(auVar231);
                      (*pGVar7->occlusionFilterN)(&local_a50);
                      auVar275 = ZEXT3264(_local_a00);
                      auVar111 = local_900._0_16_;
                    }
                    if (auVar111 == (undefined1  [16])0x0) {
                      auVar111 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar111 = auVar111 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        (*p_Var8)(&local_a50);
                        auVar275 = ZEXT3264(_local_a00);
                        auVar111 = local_900._0_16_;
                      }
                      auVar5 = vpcmpeqd_avx(auVar111,_DAT_01f45a50);
                      auVar111 = auVar5 ^ _DAT_01f46b70;
                      auVar165._8_4_ = 0xff800000;
                      auVar165._0_8_ = 0xff800000ff800000;
                      auVar165._12_4_ = 0xff800000;
                      auVar5 = vblendvps_avx(auVar165,*(undefined1 (*) [16])(local_a50.ray + 0x80),
                                             auVar5);
                      *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar5;
                    }
                    auVar143._8_8_ = 0x100000001;
                    auVar143._0_8_ = 0x100000001;
                    bVar102 = (auVar143 & auVar111) != (undefined1  [16])0x0;
                    if (!(bool)bVar102) {
                      *(float *)(ray + k * 4 + 0x80) = fVar204;
                    }
                  }
                  goto LAB_01389d0b;
                }
              }
              bVar102 = 0;
              goto LAB_01389d0b;
            }
          }
          uVar100 = uVar100 + 1;
        }
        bVar101 = false;
LAB_01389ce7:
        auVar275 = ZEXT3264(_local_a00);
LAB_01389d0b:
        uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar176._4_4_ = uVar99;
        auVar176._0_4_ = uVar99;
        auVar176._8_4_ = uVar99;
        auVar176._12_4_ = uVar99;
        auVar176._16_4_ = uVar99;
        auVar176._20_4_ = uVar99;
        auVar176._24_4_ = uVar99;
        auVar176._28_4_ = uVar99;
        bVar97 = bVar97 | bVar101 & bVar102;
        auVar126 = vcmpps_avx(_local_8e0,auVar176,2);
        local_4c0 = vandps_avx(auVar126,local_4c0);
      }
      auVar128._0_4_ = auVar118._0_4_ + fVar133;
      auVar128._4_4_ = auVar118._4_4_ + fVar133;
      auVar128._8_4_ = auVar118._8_4_ + fVar133;
      auVar128._12_4_ = auVar118._12_4_ + fVar133;
      auVar128._16_4_ = auVar118._16_4_ + fVar133;
      auVar128._20_4_ = auVar118._20_4_ + fVar133;
      auVar128._24_4_ = auVar118._24_4_ + fVar133;
      auVar128._28_4_ = auVar118._28_4_ + fVar133;
      uVar99 = auVar176._0_4_;
      auVar154._4_4_ = uVar99;
      auVar154._0_4_ = uVar99;
      auVar154._8_4_ = uVar99;
      auVar154._12_4_ = uVar99;
      auVar154._16_4_ = uVar99;
      auVar154._20_4_ = uVar99;
      auVar154._24_4_ = uVar99;
      auVar154._28_4_ = uVar99;
      auVar12 = vcmpps_avx(auVar128,auVar154,2);
      _local_8e0 = vandps_avx(auVar12,auVar275._0_32_);
      auVar129._8_4_ = 3;
      auVar129._0_8_ = 0x300000003;
      auVar129._12_4_ = 3;
      auVar129._16_4_ = 3;
      auVar129._20_4_ = 3;
      auVar129._24_4_ = 3;
      auVar129._28_4_ = 3;
      auVar155._8_4_ = 2;
      auVar155._0_8_ = 0x200000002;
      auVar155._12_4_ = 2;
      auVar155._16_4_ = 2;
      auVar155._20_4_ = 2;
      auVar155._24_4_ = 2;
      auVar155._28_4_ = 2;
      auVar12 = vblendvps_avx(auVar155,auVar129,local_6c0);
      auVar12 = vpcmpgtd_avx2(auVar12,local_6e0);
      local_900 = vpandn_avx2(auVar12,_local_8e0);
      local_a00._4_4_ = fVar133 + (float)local_460._4_4_;
      local_a00._0_4_ = fVar133 + (float)local_460._0_4_;
      fStack_9f8 = fVar133 + fStack_458;
      fStack_9f4 = fVar133 + fStack_454;
      fStack_9f0 = fVar133 + fStack_450;
      fStack_9ec = fVar133 + fStack_44c;
      fStack_9e8 = fVar133 + fStack_448;
      fStack_9e4 = fVar133 + fStack_444;
      for (; (((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(local_900 >> 0x7f,0) != '\0') ||
               (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(local_900 >> 0xbf,0) != '\0') ||
             (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             local_900[0x1f] < '\0'; local_900 = vandps_avx(auVar13,local_900)) {
        auVar156._8_4_ = 0x7f800000;
        auVar156._0_8_ = 0x7f8000007f800000;
        auVar156._12_4_ = 0x7f800000;
        auVar156._16_4_ = 0x7f800000;
        auVar156._20_4_ = 0x7f800000;
        auVar156._24_4_ = 0x7f800000;
        auVar156._28_4_ = 0x7f800000;
        auVar13 = vblendvps_avx(auVar156,auVar126,local_900);
        auVar118 = vshufps_avx(auVar13,auVar13,0xb1);
        auVar118 = vminps_avx(auVar13,auVar118);
        auVar14 = vshufpd_avx(auVar118,auVar118,5);
        auVar118 = vminps_avx(auVar118,auVar14);
        auVar14 = vpermpd_avx2(auVar118,0x4e);
        auVar118 = vminps_avx(auVar118,auVar14);
        auVar118 = vcmpps_avx(auVar13,auVar118,0);
        auVar14 = local_900 & auVar118;
        auVar13 = local_900;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar13 = vandps_avx(auVar118,local_900);
        }
        uVar92 = vmovmskps_avx(auVar13);
        iVar16 = 0;
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          iVar16 = iVar16 + 1;
        }
        uVar98 = (ulong)(uint)(iVar16 << 2);
        *(undefined4 *)(local_900 + uVar98) = 0;
        uVar92 = *(uint *)(local_1c0 + uVar98);
        uVar96 = *(uint *)(local_440 + uVar98);
        fVar189 = auVar11._0_4_;
        if ((float)local_980._0_4_ < 0.0) {
          auVar282 = ZEXT1664(auVar282._0_16_);
          auVar288 = ZEXT1664(auVar288._0_16_);
          fVar189 = sqrtf((float)local_980._0_4_);
          uVar98 = extraout_RAX_03;
        }
        auVar247 = ZEXT464(uVar96);
        auVar5 = vminps_avx(auVar3,auVar4);
        auVar111 = vmaxps_avx(auVar3,auVar4);
        auVar291 = vminps_avx(auVar1,auVar2);
        auVar107 = vminps_avx(auVar5,auVar291);
        auVar5 = vmaxps_avx(auVar1,auVar2);
        auVar291 = vmaxps_avx(auVar111,auVar5);
        local_840._8_4_ = NAN;
        local_840._0_8_ = 0x7fffffff7fffffff;
        local_840._12_4_ = NAN;
        auVar111 = vandps_avx(auVar107,local_840._0_16_);
        auVar5 = vandps_avx(auVar291,local_840._0_16_);
        auVar111 = vmaxps_avx(auVar111,auVar5);
        auVar5 = vmovshdup_avx(auVar111);
        auVar5 = vmaxss_avx(auVar5,auVar111);
        auVar111 = vshufpd_avx(auVar111,auVar111,1);
        auVar111 = vmaxss_avx(auVar111,auVar5);
        fVar204 = auVar111._0_4_ * 1.9073486e-06;
        local_860._0_4_ = fVar189 * 1.9073486e-06;
        local_8c0._0_16_ = vshufps_avx(auVar291,auVar291,0xff);
        auVar111 = vinsertps_avx(ZEXT416(uVar96),ZEXT416(uVar92),0x10);
        auVar264 = ZEXT1664(auVar111);
        uVar100 = 0;
        while( true ) {
          auVar111 = auVar264._0_16_;
          bVar102 = (byte)uVar98;
          if (uVar100 == 5) break;
          auVar291 = vmovshdup_avx(auVar111);
          fVar251 = auVar291._0_4_;
          fVar238 = 1.0 - fVar251;
          fVar219 = fVar238 * fVar238 * fVar238;
          fVar218 = fVar251 * fVar251 * fVar251;
          auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                     ZEXT416((uint)fVar218));
          fVar189 = fVar251 * fVar238;
          auVar221 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar189 * 6.0)),
                                     ZEXT416((uint)(fVar238 * fVar189)),
                                     SUB6416(ZEXT464(0x41400000),0));
          auVar169 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * fVar189 * 6.0)),
                                     SUB6416(ZEXT464(0x41400000),0),
                                     ZEXT416((uint)(fVar251 * fVar189)));
          auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                   ZEXT416((uint)fVar219));
          fVar217 = (auVar5._0_4_ + auVar169._0_4_) * 0.16666667;
          fVar218 = fVar218 * 0.16666667;
          auVar144._0_4_ = fVar218 * fVar188;
          auVar144._4_4_ = fVar218 * fStack_afc;
          auVar144._8_4_ = fVar218 * fStack_af8;
          auVar144._12_4_ = fVar218 * fStack_af4;
          auVar195._4_4_ = fVar217;
          auVar195._0_4_ = fVar217;
          auVar195._8_4_ = fVar217;
          auVar195._12_4_ = fVar217;
          auVar5 = vfmadd132ps_fma(auVar195,auVar144,auVar1);
          fVar217 = (auVar107._0_4_ + auVar221._0_4_) * 0.16666667;
          auVar145._4_4_ = fVar217;
          auVar145._0_4_ = fVar217;
          auVar145._8_4_ = fVar217;
          auVar145._12_4_ = fVar217;
          auVar5 = vfmadd132ps_fma(auVar145,auVar5,auVar4);
          fVar218 = auVar264._0_4_;
          auVar166._4_4_ = fVar218;
          auVar166._0_4_ = fVar218;
          auVar166._8_4_ = fVar218;
          auVar166._12_4_ = fVar218;
          auVar107 = vfmadd213ps_fma(auVar166,local_970,_DAT_01f45a50);
          fVar219 = fVar219 * 0.16666667;
          auVar112._4_4_ = fVar219;
          auVar112._0_4_ = fVar219;
          auVar112._8_4_ = fVar219;
          auVar112._12_4_ = fVar219;
          auVar5 = vfmadd132ps_fma(auVar112,auVar5,auVar3);
          local_820._0_16_ = auVar5;
          auVar5 = vsubps_avx(auVar107,auVar5);
          _local_a20 = auVar5;
          auVar5 = vdpps_avx(auVar5,auVar5,0x7f);
          fVar217 = auVar5._0_4_;
          if (fVar217 < 0.0) {
            auVar264._0_4_ = sqrtf(fVar217);
            auVar264._4_60_ = extraout_var_00;
            auVar107 = auVar264._0_16_;
            uVar98 = extraout_RAX_04;
          }
          else {
            auVar107 = vsqrtss_avx(auVar5,auVar5);
          }
          auVar278 = ZEXT416((uint)fVar238);
          auVar113._4_4_ = fVar238;
          auVar113._0_4_ = fVar238;
          auVar113._8_4_ = fVar238;
          auVar113._12_4_ = fVar238;
          auVar169 = vfnmsub213ss_fma(auVar291,auVar291,ZEXT416((uint)(fVar189 * 4.0)));
          auVar221 = vfmadd231ss_fma(ZEXT416((uint)(fVar189 * 4.0)),auVar278,auVar278);
          fVar189 = fVar238 * -fVar238 * 0.5;
          fVar219 = auVar169._0_4_ * 0.5;
          fVar238 = auVar221._0_4_ * 0.5;
          fVar251 = fVar251 * fVar251 * 0.5;
          auVar224._0_4_ = fVar188 * fVar251;
          auVar224._4_4_ = fStack_afc * fVar251;
          auVar224._8_4_ = fStack_af8 * fVar251;
          auVar224._12_4_ = fStack_af4 * fVar251;
          auVar196._4_4_ = fVar238;
          auVar196._0_4_ = fVar238;
          auVar196._8_4_ = fVar238;
          auVar196._12_4_ = fVar238;
          auVar221 = vfmadd213ps_fma(auVar196,auVar1,auVar224);
          auVar209._4_4_ = fVar219;
          auVar209._0_4_ = fVar219;
          auVar209._8_4_ = fVar219;
          auVar209._12_4_ = fVar219;
          auVar221 = vfmadd213ps_fma(auVar209,auVar4,auVar221);
          auVar272._4_4_ = fVar189;
          auVar272._0_4_ = fVar189;
          auVar272._8_4_ = fVar189;
          auVar272._12_4_ = fVar189;
          auVar231 = vfmadd213ps_fma(auVar272,auVar3,auVar221);
          auVar221 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar278,auVar291);
          auVar169 = vfmadd213ss_fma(auVar291,SUB6416(ZEXT464(0xc0000000),0),auVar278);
          auVar291 = vshufps_avx(auVar111,auVar111,0x55);
          auVar197._0_4_ = fVar188 * auVar291._0_4_;
          auVar197._4_4_ = fStack_afc * auVar291._4_4_;
          auVar197._8_4_ = fStack_af8 * auVar291._8_4_;
          auVar197._12_4_ = fStack_af4 * auVar291._12_4_;
          uVar99 = auVar169._0_4_;
          auVar210._4_4_ = uVar99;
          auVar210._0_4_ = uVar99;
          auVar210._8_4_ = uVar99;
          auVar210._12_4_ = uVar99;
          auVar291 = vfmadd213ps_fma(auVar210,auVar1,auVar197);
          auVar167._0_4_ = auVar221._0_4_;
          auVar167._4_4_ = auVar167._0_4_;
          auVar167._8_4_ = auVar167._0_4_;
          auVar167._12_4_ = auVar167._0_4_;
          auVar291 = vfmadd213ps_fma(auVar167,auVar4,auVar291);
          auVar278 = vfmadd231ps_fma(auVar291,auVar3,auVar113);
          auVar221 = vdpps_avx(auVar231,auVar231,0x7f);
          auVar291 = vblendps_avx(auVar221,_DAT_01f45a50,0xe);
          auVar169 = vrsqrtss_avx(auVar291,auVar291);
          fVar189 = auVar169._0_4_;
          fVar238 = auVar221._0_4_;
          fVar189 = fVar189 * 1.5 + fVar238 * -0.5 * fVar189 * fVar189 * fVar189;
          auVar169 = vdpps_avx(auVar231,auVar278,0x7f);
          auVar168._0_4_ = auVar278._0_4_ * fVar238;
          auVar168._4_4_ = auVar278._4_4_ * fVar238;
          auVar168._8_4_ = auVar278._8_4_ * fVar238;
          auVar168._12_4_ = auVar278._12_4_ * fVar238;
          fVar219 = auVar169._0_4_;
          auVar225._0_4_ = auVar231._0_4_ * fVar219;
          auVar225._4_4_ = auVar231._4_4_ * fVar219;
          fVar251 = auVar231._8_4_;
          auVar225._8_4_ = fVar251 * fVar219;
          fVar239 = auVar231._12_4_;
          auVar225._12_4_ = fVar239 * fVar219;
          auVar169 = vsubps_avx(auVar168,auVar225);
          auVar291 = vrcpss_avx(auVar291,auVar291);
          auVar278 = vfnmadd213ss_fma(auVar291,auVar221,ZEXT416(0x40000000));
          fVar219 = auVar291._0_4_ * auVar278._0_4_;
          auVar291 = vmaxss_avx(ZEXT416((uint)fVar204),
                                ZEXT416((uint)(fVar218 * (float)local_860._0_4_)));
          auVar247 = ZEXT1664(auVar291);
          auVar257._0_8_ = auVar231._0_8_ ^ 0x8000000080000000;
          auVar257._8_4_ = -fVar251;
          auVar257._12_4_ = -fVar239;
          auVar198._0_4_ = fVar189 * auVar169._0_4_ * fVar219;
          auVar198._4_4_ = fVar189 * auVar169._4_4_ * fVar219;
          auVar198._8_4_ = fVar189 * auVar169._8_4_ * fVar219;
          auVar198._12_4_ = fVar189 * auVar169._12_4_ * fVar219;
          auVar284._0_4_ = auVar231._0_4_ * fVar189;
          auVar284._4_4_ = auVar231._4_4_ * fVar189;
          auVar284._8_4_ = fVar251 * fVar189;
          auVar284._12_4_ = fVar239 * fVar189;
          if (fVar238 < -fVar238) {
            local_9a0._0_16_ = auVar284;
            local_9c0._0_16_ = auVar198;
            fVar189 = sqrtf(fVar238);
            auVar247 = ZEXT464(auVar291._0_4_);
            auVar107 = ZEXT416(auVar107._0_4_);
            uVar98 = extraout_RAX_05;
            auVar198 = local_9c0._0_16_;
            auVar284 = local_9a0._0_16_;
          }
          else {
            auVar221 = vsqrtss_avx(auVar221,auVar221);
            fVar189 = auVar221._0_4_;
          }
          auVar221 = vdpps_avx(_local_a20,auVar284,0x7f);
          auVar285 = vfmadd213ss_fma(ZEXT416((uint)fVar204),auVar107,auVar247._0_16_);
          auVar169 = vdpps_avx(auVar257,auVar284,0x7f);
          auVar278 = vdpps_avx(_local_a20,auVar198,0x7f);
          auVar283 = vdpps_avx(local_970,auVar284,0x7f);
          auVar285 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                     ZEXT416((uint)(fVar204 / fVar189)),auVar285);
          auVar282 = ZEXT1664(auVar285);
          fVar189 = auVar169._0_4_ + auVar278._0_4_;
          auVar288 = ZEXT464((uint)fVar189);
          fVar219 = auVar221._0_4_;
          auVar114._0_4_ = fVar219 * fVar219;
          auVar114._4_4_ = auVar221._4_4_ * auVar221._4_4_;
          auVar114._8_4_ = auVar221._8_4_ * auVar221._8_4_;
          auVar114._12_4_ = auVar221._12_4_ * auVar221._12_4_;
          auVar107 = vdpps_avx(_local_a20,auVar257,0x7f);
          auVar278 = vsubps_avx(auVar5,auVar114);
          auVar169 = vrsqrtss_avx(auVar278,auVar278);
          fVar238 = auVar278._0_4_;
          fVar218 = auVar169._0_4_;
          fVar218 = fVar218 * 1.5 + fVar238 * -0.5 * fVar218 * fVar218 * fVar218;
          auVar169 = vdpps_avx(_local_a20,local_970,0x7f);
          auVar107 = vfnmadd231ss_fma(auVar107,auVar221,ZEXT416((uint)fVar189));
          auVar169 = vfnmadd231ss_fma(auVar169,auVar221,auVar283);
          if (fVar238 < 0.0) {
            local_9a0._0_16_ = ZEXT416((uint)fVar189);
            local_9c0._0_16_ = auVar283;
            local_960._0_16_ = auVar107;
            local_880._0_4_ = fVar218;
            local_8a0._0_16_ = auVar169;
            fVar189 = sqrtf(fVar238);
            auVar288 = ZEXT1664(local_9a0._0_16_);
            auVar282 = ZEXT464(auVar285._0_4_);
            auVar247 = ZEXT464(auVar291._0_4_);
            uVar98 = extraout_RAX_06;
            fVar218 = (float)local_880._0_4_;
            auVar169 = local_8a0._0_16_;
            auVar283 = local_9c0._0_16_;
            auVar107 = local_960._0_16_;
          }
          else {
            auVar291 = vsqrtss_avx(auVar278,auVar278);
            fVar189 = auVar291._0_4_;
          }
          auVar291 = vpermilps_avx(local_820._0_16_,0xff);
          fVar189 = fVar189 - auVar291._0_4_;
          auVar278 = vshufps_avx(auVar231,auVar231,0xff);
          auVar291 = vfmsub213ss_fma(auVar107,ZEXT416((uint)fVar218),auVar278);
          auVar199._0_8_ = auVar283._0_8_ ^ 0x8000000080000000;
          auVar199._8_4_ = auVar283._8_4_ ^ 0x80000000;
          auVar199._12_4_ = auVar283._12_4_ ^ 0x80000000;
          auVar211._0_8_ = auVar291._0_8_ ^ 0x8000000080000000;
          auVar211._8_4_ = auVar291._8_4_ ^ 0x80000000;
          auVar211._12_4_ = auVar291._12_4_ ^ 0x80000000;
          auVar169 = ZEXT416((uint)(auVar169._0_4_ * fVar218));
          auVar285 = auVar288._0_16_;
          auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar283._0_4_ * auVar291._0_4_)),auVar285,
                                     auVar169);
          auVar291 = vinsertps_avx(auVar211,auVar169,0x1c);
          uVar99 = auVar107._0_4_;
          auVar212._4_4_ = uVar99;
          auVar212._0_4_ = uVar99;
          auVar212._8_4_ = uVar99;
          auVar212._12_4_ = uVar99;
          auVar291 = vdivps_avx(auVar291,auVar212);
          auVar107 = vinsertps_avx(auVar285,auVar199,0x10);
          auVar107 = vdivps_avx(auVar107,auVar212);
          auVar170._0_4_ = fVar219 * auVar291._0_4_ + fVar189 * auVar107._0_4_;
          auVar170._4_4_ = fVar219 * auVar291._4_4_ + fVar189 * auVar107._4_4_;
          auVar170._8_4_ = fVar219 * auVar291._8_4_ + fVar189 * auVar107._8_4_;
          auVar170._12_4_ = fVar219 * auVar291._12_4_ + fVar189 * auVar107._12_4_;
          auVar291 = vsubps_avx(auVar111,auVar170);
          auVar264 = ZEXT1664(auVar291);
          auVar111 = vandps_avx(auVar221,local_840._0_16_);
          if (auVar111._0_4_ < auVar282._0_4_) {
            auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar282._0_4_ + auVar247._0_4_)),
                                       local_8c0._0_16_,ZEXT416(0x36000000));
            auVar111 = vandps_avx(ZEXT416((uint)fVar189),local_840._0_16_);
            if (auVar111._0_4_ < auVar107._0_4_) {
              bVar101 = uVar100 < 5;
              fVar189 = auVar291._0_4_ + (float)local_940._0_4_;
              if (fVar189 < fVar103) {
                bVar102 = 0;
                goto LAB_0138a794;
              }
              fVar204 = *(float *)(ray + k * 4 + 0x80);
              auVar282 = ZEXT464((uint)fVar204);
              if (fVar189 <= fVar204) {
                auVar111 = vmovshdup_avx(auVar291);
                bVar102 = 0;
                if ((auVar111._0_4_ < 0.0) || (1.0 < auVar111._0_4_)) goto LAB_0138a794;
                auVar111 = vrsqrtss_avx(auVar5,auVar5);
                fVar218 = auVar111._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar93].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar102 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar217 = fVar218 * 1.5 + fVar217 * -0.5 * fVar218 * fVar218 * fVar218;
                    auVar171._0_4_ = fVar217 * (float)local_a20._0_4_;
                    auVar171._4_4_ = fVar217 * (float)local_a20._4_4_;
                    auVar171._8_4_ = fVar217 * fStack_a18;
                    auVar171._12_4_ = fVar217 * fStack_a14;
                    auVar221 = vfmadd213ps_fma(auVar278,auVar171,auVar231);
                    auVar111 = vshufps_avx(auVar171,auVar171,0xc9);
                    auVar5 = vshufps_avx(auVar231,auVar231,0xc9);
                    auVar172._0_4_ = auVar171._0_4_ * auVar5._0_4_;
                    auVar172._4_4_ = auVar171._4_4_ * auVar5._4_4_;
                    auVar172._8_4_ = auVar171._8_4_ * auVar5._8_4_;
                    auVar172._12_4_ = auVar171._12_4_ * auVar5._12_4_;
                    auVar107 = vfmsub231ps_fma(auVar172,auVar231,auVar111);
                    auVar111 = vshufps_avx(auVar107,auVar107,0xc9);
                    auVar5 = vshufps_avx(auVar221,auVar221,0xc9);
                    auVar107 = vshufps_avx(auVar107,auVar107,0xd2);
                    auVar115._0_4_ = auVar221._0_4_ * auVar107._0_4_;
                    auVar115._4_4_ = auVar221._4_4_ * auVar107._4_4_;
                    auVar115._8_4_ = auVar221._8_4_ * auVar107._8_4_;
                    auVar115._12_4_ = auVar221._12_4_ * auVar107._12_4_;
                    auVar111 = vfmsub231ps_fma(auVar115,auVar111,auVar5);
                    local_7b0 = vshufps_avx(auVar291,auVar291,0x55);
                    local_7e0 = (RTCHitN  [16])vshufps_avx(auVar111,auVar111,0x55);
                    auStack_7d0 = vshufps_avx(auVar111,auVar111,0xaa);
                    local_7c0 = auVar111._0_4_;
                    local_7a0 = ZEXT416(0) << 0x20;
                    local_790 = CONCAT44(uStack_7fc,local_800);
                    uStack_788 = CONCAT44(uStack_7f4,uStack_7f8);
                    local_780._4_4_ = uStack_7ec;
                    local_780._0_4_ = local_7f0;
                    local_780._8_4_ = uStack_7e8;
                    local_780._12_4_ = uStack_7e4;
                    vpcmpeqd_avx2(ZEXT1632(local_780),ZEXT1632(local_780));
                    uStack_76c = context->user->instID[0];
                    local_770 = uStack_76c;
                    uStack_768 = uStack_76c;
                    uStack_764 = uStack_76c;
                    uStack_760 = context->user->instPrimID[0];
                    uStack_75c = uStack_760;
                    uStack_758 = uStack_760;
                    uStack_754 = uStack_760;
                    *(float *)(ray + k * 4 + 0x80) = fVar189;
                    local_930 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                    local_a50.valid = (int *)local_930;
                    local_a50.geometryUserPtr = pGVar7->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_7e0;
                    local_a50.N = 4;
                    local_a50.ray = (RTCRayN *)ray;
                    uStack_7bc = local_7c0;
                    uStack_7b8 = local_7c0;
                    uStack_7b4 = local_7c0;
                    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar264 = ZEXT1664(auVar291);
                      auVar288 = ZEXT1664(auVar285);
                      (*pGVar7->occlusionFilterN)(&local_a50);
                    }
                    if (local_930 == (undefined1  [16])0x0) {
                      auVar111 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar111 = auVar111 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar288 = ZEXT1664(auVar288._0_16_);
                        (*p_Var8)(&local_a50);
                      }
                      auVar5 = vpcmpeqd_avx(local_930,_DAT_01f45a50);
                      auVar111 = auVar5 ^ _DAT_01f46b70;
                      auVar173._8_4_ = 0xff800000;
                      auVar173._0_8_ = 0xff800000ff800000;
                      auVar173._12_4_ = 0xff800000;
                      auVar5 = vblendvps_avx(auVar173,*(undefined1 (*) [16])(local_a50.ray + 0x80),
                                             auVar5);
                      *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar5;
                    }
                    auVar282 = ZEXT464((uint)fVar204);
                    auVar146._8_8_ = 0x100000001;
                    auVar146._0_8_ = 0x100000001;
                    bVar102 = (auVar146 & auVar111) != (undefined1  [16])0x0;
                    if (!(bool)bVar102) {
                      *(float *)(ray + k * 4 + 0x80) = fVar204;
                    }
                  }
                  goto LAB_0138a794;
                }
              }
              bVar102 = 0;
              goto LAB_0138a794;
            }
          }
          uVar100 = uVar100 + 1;
        }
        bVar101 = false;
LAB_0138a794:
        uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar176._4_4_ = uVar99;
        auVar176._0_4_ = uVar99;
        auVar176._8_4_ = uVar99;
        auVar176._12_4_ = uVar99;
        auVar176._16_4_ = uVar99;
        auVar176._20_4_ = uVar99;
        auVar176._24_4_ = uVar99;
        auVar176._28_4_ = uVar99;
        bVar97 = bVar97 | bVar101 & bVar102;
        auVar13 = vcmpps_avx(_local_a00,auVar176,2);
      }
      auVar157._0_4_ = fVar133 + local_4a0._0_4_;
      auVar157._4_4_ = fVar133 + local_4a0._4_4_;
      auVar157._8_4_ = fVar133 + local_4a0._8_4_;
      auVar157._12_4_ = fVar133 + local_4a0._12_4_;
      auVar157._16_4_ = fVar133 + local_4a0._16_4_;
      auVar157._20_4_ = fVar133 + local_4a0._20_4_;
      auVar157._24_4_ = fVar133 + local_4a0._24_4_;
      auVar157._28_4_ = fVar133 + local_4a0._28_4_;
      uVar99 = auVar176._0_4_;
      auVar203._4_4_ = uVar99;
      auVar203._0_4_ = uVar99;
      auVar203._8_4_ = uVar99;
      auVar203._12_4_ = uVar99;
      auVar203._16_4_ = uVar99;
      auVar203._20_4_ = uVar99;
      auVar203._24_4_ = uVar99;
      auVar203._28_4_ = uVar99;
      auVar13 = vcmpps_avx(auVar157,auVar203,2);
      auVar126 = vandps_avx(local_6a0,local_680);
      auVar126 = vandps_avx(auVar13,auVar126);
      auVar216._0_4_ = fVar133 + local_460._0_4_;
      auVar216._4_4_ = fVar133 + local_460._4_4_;
      auVar216._8_4_ = fVar133 + local_460._8_4_;
      auVar216._12_4_ = fVar133 + local_460._12_4_;
      auVar216._16_4_ = fVar133 + local_460._16_4_;
      auVar216._20_4_ = fVar133 + local_460._20_4_;
      auVar216._24_4_ = fVar133 + local_460._24_4_;
      auVar216._28_4_ = fVar133 + local_460._28_4_;
      auVar13 = vcmpps_avx(auVar216,auVar203,2);
      auVar12 = vandps_avx(auVar12,_local_8e0);
      auVar12 = vandps_avx(auVar13,auVar12);
      auVar12 = vorps_avx(auVar126,auVar12);
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar12;
        auVar126 = vblendvps_avx(_local_460,local_4a0,auVar126);
        *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar126;
        uVar98 = vmovlps_avx(local_650);
        (&uStack_140)[uVar94 * 0xc] = uVar98;
        aiStack_138[uVar94 * 0x18] = local_c24 + 1;
        uVar94 = (ulong)((int)uVar94 + 1);
      }
      auVar275 = ZEXT3264(local_9e0);
    }
    while( true ) {
      uVar92 = (uint)uVar94;
      if (uVar92 == 0) {
        if (bVar97 != 0) goto LAB_0138ac85;
        uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar132._4_4_ = uVar99;
        auVar132._0_4_ = uVar99;
        auVar132._8_4_ = uVar99;
        auVar132._12_4_ = uVar99;
        auVar132._16_4_ = uVar99;
        auVar132._20_4_ = uVar99;
        auVar132._24_4_ = uVar99;
        auVar132._28_4_ = uVar99;
        auVar126 = vcmpps_avx(local_380,auVar132,2);
        uVar93 = vmovmskps_avx(auVar126);
        local_908 = (ulong)((uint)local_910 & uVar93);
        goto LAB_013884b6;
      }
      uVar94 = (ulong)(uVar92 - 1);
      lVar95 = uVar94 * 0x60;
      auVar126 = *(undefined1 (*) [32])(auStack_160 + lVar95);
      auVar125._0_4_ = fVar133 + auVar126._0_4_;
      auVar125._4_4_ = fVar133 + auVar126._4_4_;
      auVar125._8_4_ = fVar133 + auVar126._8_4_;
      auVar125._12_4_ = fVar133 + auVar126._12_4_;
      auVar125._16_4_ = fVar133 + auVar126._16_4_;
      auVar125._20_4_ = fVar133 + auVar126._20_4_;
      auVar125._24_4_ = fVar133 + auVar126._24_4_;
      auVar125._28_4_ = fVar133 + auVar126._28_4_;
      uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar201._4_4_ = uVar99;
      auVar201._0_4_ = uVar99;
      auVar201._8_4_ = uVar99;
      auVar201._12_4_ = uVar99;
      auVar201._16_4_ = uVar99;
      auVar201._20_4_ = uVar99;
      auVar201._24_4_ = uVar99;
      auVar201._28_4_ = uVar99;
      auVar12 = vcmpps_avx(auVar125,auVar201,2);
      _local_7e0 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar95));
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar95) & auVar12;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') break;
      uVar94 = (ulong)(uVar92 - 1);
    }
    auVar182._8_4_ = 0x7f800000;
    auVar182._0_8_ = 0x7f8000007f800000;
    auVar182._12_4_ = 0x7f800000;
    auVar182._16_4_ = 0x7f800000;
    auVar182._20_4_ = 0x7f800000;
    auVar182._24_4_ = 0x7f800000;
    auVar182._28_4_ = 0x7f800000;
    auVar126 = vblendvps_avx(auVar182,auVar126,_local_7e0);
    auVar12 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar12 = vminps_avx(auVar126,auVar12);
    auVar13 = vshufpd_avx(auVar12,auVar12,5);
    auVar12 = vminps_avx(auVar12,auVar13);
    auVar13 = vpermpd_avx2(auVar12,0x4e);
    auVar12 = vminps_avx(auVar12,auVar13);
    auVar12 = vcmpps_avx(auVar126,auVar12,0);
    auVar13 = _local_7e0 & auVar12;
    auVar126 = _local_7e0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar126 = vandps_avx(auVar12,_local_7e0);
    }
    uVar96 = vmovmskps_avx(auVar126);
    iVar16 = 0;
    for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
      iVar16 = iVar16 + 1;
    }
    *(undefined4 *)(local_7e0 + (uint)(iVar16 << 2)) = 0;
    uVar98 = (&uStack_140)[uVar94 * 0xc];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar98;
    local_c24 = aiStack_138[uVar94 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar95) = _local_7e0;
    uVar96 = uVar92 - 1;
    if ((((((((_local_7e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7e0 >> 0x7f,0) != '\0') ||
          (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7e0 >> 0xbf,0) != '\0') ||
        (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7e0[0x1f] < '\0') {
      uVar96 = uVar92;
    }
    uVar99 = (undefined4)uVar98;
    auVar151._4_4_ = uVar99;
    auVar151._0_4_ = uVar99;
    auVar151._8_4_ = uVar99;
    auVar151._12_4_ = uVar99;
    auVar151._16_4_ = uVar99;
    auVar151._20_4_ = uVar99;
    auVar151._24_4_ = uVar99;
    auVar151._28_4_ = uVar99;
    auVar111 = vmovshdup_avx(auVar105);
    auVar111 = vsubps_avx(auVar111,auVar105);
    auVar127._0_4_ = auVar111._0_4_;
    auVar127._4_4_ = auVar127._0_4_;
    auVar127._8_4_ = auVar127._0_4_;
    auVar127._12_4_ = auVar127._0_4_;
    auVar127._16_4_ = auVar127._0_4_;
    auVar127._20_4_ = auVar127._0_4_;
    auVar127._24_4_ = auVar127._0_4_;
    auVar127._28_4_ = auVar127._0_4_;
    auVar111 = vfmadd132ps_fma(auVar127,auVar151,_DAT_01f7b040);
    local_4a0 = ZEXT1632(auVar111);
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar16 << 2));
    uVar94 = (ulong)uVar96;
    fVar189 = fVar133;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }